

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  uint uVar18;
  Geometry *pGVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [28];
  undefined1 auVar103 [24];
  int iVar104;
  uint uVar105;
  uint uVar106;
  ulong uVar107;
  long lVar108;
  undefined1 auVar116 [16];
  ulong uVar109;
  undefined4 uVar110;
  undefined8 unaff_R13;
  ulong uVar111;
  long lVar112;
  undefined8 uVar113;
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar115 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar150;
  undefined1 auVar152 [16];
  float fVar151;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined8 uVar176;
  float fVar186;
  undefined1 auVar177 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar185;
  float fVar187;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar208;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 in_ZMM9 [64];
  undefined1 auVar211 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 in_ZMM10 [64];
  undefined1 auVar221 [64];
  undefined4 uVar225;
  undefined1 auVar226 [16];
  float fVar227;
  float fVar233;
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  float fVar234;
  float fVar239;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  float fVar242;
  float fVar243;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  RayHitK<8> *local_7e0;
  RayQueryContext *local_7d8;
  size_t local_7d0;
  undefined1 (*local_7c8) [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 uStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  LinearSpace3fa *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  int local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar111 = (ulong)(byte)PVar17;
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar151 = *(float *)(prim + uVar111 * 0x19 + 0x12);
  auVar21 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + uVar111 * 0x19 + 6));
  auVar114._0_4_ = fVar151 * auVar21._0_4_;
  auVar114._4_4_ = fVar151 * auVar21._4_4_;
  auVar114._8_4_ = fVar151 * auVar21._8_4_;
  auVar114._12_4_ = fVar151 * auVar21._12_4_;
  auVar177._0_4_ = fVar151 * auVar22._0_4_;
  auVar177._4_4_ = fVar151 * auVar22._4_4_;
  auVar177._8_4_ = fVar151 * auVar22._8_4_;
  auVar177._12_4_ = fVar151 * auVar22._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar111 * 4 + 6);
  auVar119 = vpmovsxbd_avx2(auVar21);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar111 * 5 + 6);
  auVar220 = vpmovsxbd_avx2(auVar22);
  auVar220 = vcvtdq2ps_avx(auVar220);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar111 * 6 + 6);
  auVar184 = vpmovsxbd_avx2(auVar116);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar111 * 0xb + 6);
  auVar130 = vpmovsxbd_avx2(auVar11);
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar111 * 0xc + 6);
  auVar139 = vpmovsxbd_avx2(auVar12);
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar111 * 0xd + 6);
  auVar180 = vpmovsxbd_avx2(auVar13);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar111 * 0x12 + 6);
  auVar25 = vpmovsxbd_avx2(auVar14);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar111 * 0x13 + 6);
  auVar26 = vpmovsxbd_avx2(auVar15);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar111 * 0x14 + 6);
  auVar27 = vpmovsxbd_avx2(auVar16);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar235._4_4_ = auVar177._0_4_;
  auVar235._0_4_ = auVar177._0_4_;
  auVar235._8_4_ = auVar177._0_4_;
  auVar235._12_4_ = auVar177._0_4_;
  auVar235._16_4_ = auVar177._0_4_;
  auVar235._20_4_ = auVar177._0_4_;
  auVar235._24_4_ = auVar177._0_4_;
  auVar235._28_4_ = auVar177._0_4_;
  auVar21 = vmovshdup_avx(auVar177);
  uVar176 = auVar21._0_8_;
  auVar244._8_8_ = uVar176;
  auVar244._0_8_ = uVar176;
  auVar244._16_8_ = uVar176;
  auVar244._24_8_ = uVar176;
  auVar21 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar151 = auVar21._0_4_;
  auVar237._0_4_ = fVar151 * auVar184._0_4_;
  fVar150 = auVar21._4_4_;
  auVar237._4_4_ = fVar150 * auVar184._4_4_;
  auVar237._8_4_ = fVar151 * auVar184._8_4_;
  auVar237._12_4_ = fVar150 * auVar184._12_4_;
  auVar237._16_4_ = fVar151 * auVar184._16_4_;
  auVar237._20_4_ = fVar150 * auVar184._20_4_;
  auVar237._28_36_ = in_ZMM10._28_36_;
  auVar237._24_4_ = fVar151 * auVar184._24_4_;
  auVar231._0_4_ = auVar180._0_4_ * fVar151;
  auVar231._4_4_ = auVar180._4_4_ * fVar150;
  auVar231._8_4_ = auVar180._8_4_ * fVar151;
  auVar231._12_4_ = auVar180._12_4_ * fVar150;
  auVar231._16_4_ = auVar180._16_4_ * fVar151;
  auVar231._20_4_ = auVar180._20_4_ * fVar150;
  auVar231._28_36_ = in_ZMM9._28_36_;
  auVar231._24_4_ = auVar180._24_4_ * fVar151;
  auVar200._0_4_ = auVar27._0_4_ * fVar151;
  auVar200._4_4_ = auVar27._4_4_ * fVar150;
  auVar200._8_4_ = auVar27._8_4_ * fVar151;
  auVar200._12_4_ = auVar27._12_4_ * fVar150;
  auVar200._16_4_ = auVar27._16_4_ * fVar151;
  auVar200._20_4_ = auVar27._20_4_ * fVar150;
  auVar200._24_4_ = auVar27._24_4_ * fVar151;
  auVar200._28_4_ = 0;
  auVar21 = vfmadd231ps_fma(auVar237._0_32_,auVar244,auVar220);
  auVar22 = vfmadd231ps_fma(auVar231._0_32_,auVar244,auVar139);
  auVar116 = vfmadd231ps_fma(auVar200,auVar26,auVar244);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar235,auVar119);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar235,auVar130);
  auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar25,auVar235);
  auVar236._4_4_ = auVar114._0_4_;
  auVar236._0_4_ = auVar114._0_4_;
  auVar236._8_4_ = auVar114._0_4_;
  auVar236._12_4_ = auVar114._0_4_;
  auVar236._16_4_ = auVar114._0_4_;
  auVar236._20_4_ = auVar114._0_4_;
  auVar236._24_4_ = auVar114._0_4_;
  auVar236._28_4_ = auVar114._0_4_;
  auVar21 = vmovshdup_avx(auVar114);
  uVar176 = auVar21._0_8_;
  auVar245._8_8_ = uVar176;
  auVar245._0_8_ = uVar176;
  auVar245._16_8_ = uVar176;
  auVar245._24_8_ = uVar176;
  auVar21 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar151 = auVar21._0_4_;
  auVar178._0_4_ = fVar151 * auVar184._0_4_;
  fVar150 = auVar21._4_4_;
  auVar178._4_4_ = fVar150 * auVar184._4_4_;
  auVar178._8_4_ = fVar151 * auVar184._8_4_;
  auVar178._12_4_ = fVar150 * auVar184._12_4_;
  auVar178._16_4_ = fVar151 * auVar184._16_4_;
  auVar178._20_4_ = fVar150 * auVar184._20_4_;
  auVar178._24_4_ = fVar151 * auVar184._24_4_;
  auVar178._28_4_ = 0;
  auVar129._4_4_ = auVar180._4_4_ * fVar150;
  auVar129._0_4_ = auVar180._0_4_ * fVar151;
  auVar129._8_4_ = auVar180._8_4_ * fVar151;
  auVar129._12_4_ = auVar180._12_4_ * fVar150;
  auVar129._16_4_ = auVar180._16_4_ * fVar151;
  auVar129._20_4_ = auVar180._20_4_ * fVar150;
  auVar129._24_4_ = auVar180._24_4_ * fVar151;
  auVar129._28_4_ = auVar184._28_4_;
  auVar184._4_4_ = auVar27._4_4_ * fVar150;
  auVar184._0_4_ = auVar27._0_4_ * fVar151;
  auVar184._8_4_ = auVar27._8_4_ * fVar151;
  auVar184._12_4_ = auVar27._12_4_ * fVar150;
  auVar184._16_4_ = auVar27._16_4_ * fVar151;
  auVar184._20_4_ = auVar27._20_4_ * fVar150;
  auVar184._24_4_ = auVar27._24_4_ * fVar151;
  auVar184._28_4_ = fVar150;
  auVar21 = vfmadd231ps_fma(auVar178,auVar245,auVar220);
  auVar12 = vfmadd231ps_fma(auVar129,auVar245,auVar139);
  auVar13 = vfmadd231ps_fma(auVar184,auVar245,auVar26);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar236,auVar119);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar236,auVar130);
  auVar119 = vandps_avx(ZEXT1632(auVar11),local_2c0);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  auVar195._16_4_ = 0x219392ef;
  auVar195._20_4_ = 0x219392ef;
  auVar195._24_4_ = 0x219392ef;
  auVar195._28_4_ = 0x219392ef;
  auVar119 = vcmpps_avx(auVar119,auVar195,1);
  auVar220 = vblendvps_avx(ZEXT1632(auVar11),auVar195,auVar119);
  auVar119 = vandps_avx(ZEXT1632(auVar22),local_2c0);
  auVar119 = vcmpps_avx(auVar119,auVar195,1);
  auVar184 = vblendvps_avx(ZEXT1632(auVar22),auVar195,auVar119);
  auVar119 = vandps_avx(local_2c0,ZEXT1632(auVar116));
  auVar119 = vcmpps_avx(auVar119,auVar195,1);
  auVar130 = vrcpps_avx(auVar220);
  auVar119 = vblendvps_avx(ZEXT1632(auVar116),auVar195,auVar119);
  auVar201._8_4_ = 0x3f800000;
  auVar201._0_8_ = 0x3f8000003f800000;
  auVar201._12_4_ = 0x3f800000;
  auVar201._16_4_ = 0x3f800000;
  auVar201._20_4_ = 0x3f800000;
  auVar201._24_4_ = 0x3f800000;
  auVar201._28_4_ = 0x3f800000;
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar236,auVar25);
  auVar139 = vrcpps_avx(auVar184);
  auVar21 = vfnmadd213ps_fma(auVar220,auVar130,auVar201);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar130,auVar130);
  auVar22 = vfnmadd213ps_fma(auVar184,auVar139,auVar201);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar139,auVar139);
  auVar220 = vrcpps_avx(auVar119);
  auVar116 = vfnmadd213ps_fma(auVar119,auVar220,auVar201);
  auVar116 = vfmadd132ps_fma(ZEXT1632(auVar116),auVar220,auVar220);
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 7 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar14));
  auVar130._4_4_ = auVar21._4_4_ * auVar119._4_4_;
  auVar130._0_4_ = auVar21._0_4_ * auVar119._0_4_;
  auVar130._8_4_ = auVar21._8_4_ * auVar119._8_4_;
  auVar130._12_4_ = auVar21._12_4_ * auVar119._12_4_;
  auVar130._16_4_ = auVar119._16_4_ * 0.0;
  auVar130._20_4_ = auVar119._20_4_ * 0.0;
  auVar130._24_4_ = auVar119._24_4_ * 0.0;
  auVar130._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 9 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar14));
  auVar139._4_4_ = auVar21._4_4_ * auVar119._4_4_;
  auVar139._0_4_ = auVar21._0_4_ * auVar119._0_4_;
  auVar139._8_4_ = auVar21._8_4_ * auVar119._8_4_;
  auVar139._12_4_ = auVar21._12_4_ * auVar119._12_4_;
  auVar139._16_4_ = auVar119._16_4_ * 0.0;
  auVar139._20_4_ = auVar119._20_4_ * 0.0;
  auVar139._24_4_ = auVar119._24_4_ * 0.0;
  auVar139._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0xe + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar12));
  auVar180._4_4_ = auVar22._4_4_ * auVar119._4_4_;
  auVar180._0_4_ = auVar22._0_4_ * auVar119._0_4_;
  auVar180._8_4_ = auVar22._8_4_ * auVar119._8_4_;
  auVar180._12_4_ = auVar22._12_4_ * auVar119._12_4_;
  auVar180._16_4_ = auVar119._16_4_ * 0.0;
  auVar180._20_4_ = auVar119._20_4_ * 0.0;
  auVar180._24_4_ = auVar119._24_4_ * 0.0;
  auVar180._28_4_ = auVar119._28_4_;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar17;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar17 * 0x10 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar12));
  auVar25._4_4_ = auVar22._4_4_ * auVar119._4_4_;
  auVar25._0_4_ = auVar22._0_4_ * auVar119._0_4_;
  auVar25._8_4_ = auVar22._8_4_ * auVar119._8_4_;
  auVar25._12_4_ = auVar22._12_4_ * auVar119._12_4_;
  auVar25._16_4_ = auVar119._16_4_ * 0.0;
  auVar25._20_4_ = auVar119._20_4_ * 0.0;
  auVar25._24_4_ = auVar119._24_4_ * 0.0;
  auVar25._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0x15 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar11));
  auVar26._4_4_ = auVar119._4_4_ * auVar116._4_4_;
  auVar26._0_4_ = auVar119._0_4_ * auVar116._0_4_;
  auVar26._8_4_ = auVar119._8_4_ * auVar116._8_4_;
  auVar26._12_4_ = auVar119._12_4_ * auVar116._12_4_;
  auVar26._16_4_ = auVar119._16_4_ * 0.0;
  auVar26._20_4_ = auVar119._20_4_ * 0.0;
  auVar26._24_4_ = auVar119._24_4_ * 0.0;
  auVar26._28_4_ = auVar119._28_4_;
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0x17 + 6));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar11));
  auVar27._4_4_ = auVar116._4_4_ * auVar119._4_4_;
  auVar27._0_4_ = auVar116._0_4_ * auVar119._0_4_;
  auVar27._8_4_ = auVar116._8_4_ * auVar119._8_4_;
  auVar27._12_4_ = auVar116._12_4_ * auVar119._12_4_;
  auVar27._16_4_ = auVar119._16_4_ * 0.0;
  auVar27._20_4_ = auVar119._20_4_ * 0.0;
  auVar27._24_4_ = auVar119._24_4_ * 0.0;
  auVar27._28_4_ = auVar119._28_4_;
  auVar119 = vpminsd_avx2(auVar130,auVar139);
  auVar220 = vpminsd_avx2(auVar180,auVar25);
  auVar119 = vmaxps_avx(auVar119,auVar220);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar202._4_4_ = uVar110;
  auVar202._0_4_ = uVar110;
  auVar202._8_4_ = uVar110;
  auVar202._12_4_ = uVar110;
  auVar202._16_4_ = uVar110;
  auVar202._20_4_ = uVar110;
  auVar202._24_4_ = uVar110;
  auVar202._28_4_ = uVar110;
  auVar220 = vpminsd_avx2(auVar26,auVar27);
  auVar220 = vmaxps_avx(auVar220,auVar202);
  auVar119 = vmaxps_avx(auVar119,auVar220);
  local_80._4_4_ = auVar119._4_4_ * 0.99999964;
  local_80._0_4_ = auVar119._0_4_ * 0.99999964;
  local_80._8_4_ = auVar119._8_4_ * 0.99999964;
  local_80._12_4_ = auVar119._12_4_ * 0.99999964;
  local_80._16_4_ = auVar119._16_4_ * 0.99999964;
  local_80._20_4_ = auVar119._20_4_ * 0.99999964;
  local_80._24_4_ = auVar119._24_4_ * 0.99999964;
  local_80._28_4_ = auVar220._28_4_;
  auVar119 = vpmaxsd_avx2(auVar130,auVar139);
  auVar220 = vpmaxsd_avx2(auVar180,auVar25);
  auVar119 = vminps_avx(auVar119,auVar220);
  auVar220 = vpmaxsd_avx2(auVar26,auVar27);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar158._4_4_ = uVar110;
  auVar158._0_4_ = uVar110;
  auVar158._8_4_ = uVar110;
  auVar158._12_4_ = uVar110;
  auVar158._16_4_ = uVar110;
  auVar158._20_4_ = uVar110;
  auVar158._24_4_ = uVar110;
  auVar158._28_4_ = uVar110;
  auVar220 = vminps_avx(auVar220,auVar158);
  auVar119 = vminps_avx(auVar119,auVar220);
  auVar24._4_4_ = auVar119._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar119._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar119._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar119._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar119._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar119._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar119._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar119._28_4_;
  auVar121[4] = PVar17;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar17;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar17;
  auVar121._13_3_ = 0;
  auVar121[0x10] = PVar17;
  auVar121._17_3_ = 0;
  auVar121[0x14] = PVar17;
  auVar121._21_3_ = 0;
  auVar121[0x18] = PVar17;
  auVar121._25_3_ = 0;
  auVar121[0x1c] = PVar17;
  auVar121._29_3_ = 0;
  auVar220 = vpcmpgtd_avx2(auVar121,_DAT_01fb4ba0);
  auVar119 = vcmpps_avx(local_80,auVar24,2);
  auVar119 = vandps_avx(auVar119,auVar220);
  uVar110 = vmovmskps_avx(auVar119);
  uVar111 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar110);
  local_6a8 = pre->ray_space + k;
  local_6a0 = mm_lookupmask_ps._16_8_;
  uStack_698 = mm_lookupmask_ps._24_8_;
  uStack_690 = mm_lookupmask_ps._16_8_;
  uStack_688 = mm_lookupmask_ps._24_8_;
  local_7c8 = (undefined1 (*) [32])&local_1a0;
  iVar104 = 1 << ((uint)k & 0x1f);
  auVar119._4_4_ = iVar104;
  auVar119._0_4_ = iVar104;
  auVar119._8_4_ = iVar104;
  auVar119._12_4_ = iVar104;
  auVar119._16_4_ = iVar104;
  auVar119._20_4_ = iVar104;
  auVar119._24_4_ = iVar104;
  auVar119._28_4_ = iVar104;
  auVar220 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar119 = vpand_avx2(auVar119,auVar220);
  local_2e0 = vpcmpeqd_avx2(auVar119,auVar220);
  do {
    auVar119 = local_520;
    if (uVar111 == 0) {
      return;
    }
    lVar108 = 0;
    for (uVar107 = uVar111; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
      lVar108 = lVar108 + 1;
    }
    uVar105 = *(uint *)(prim + 2);
    uVar18 = *(uint *)(prim + lVar108 * 4 + 6);
    pGVar19 = (context->scene->geometries).items[uVar105].ptr;
    uVar107 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                              pGVar19[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar18);
    p_Var20 = pGVar19[1].intersectionFilterN;
    lVar108 = *(long *)&pGVar19[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar108 + (long)p_Var20 * uVar107);
    uVar176 = *(undefined8 *)*pauVar1;
    uVar89 = *(undefined8 *)(*pauVar1 + 8);
    auVar16 = *pauVar1;
    auVar13 = *pauVar1;
    auVar116 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(lVar108 + (uVar107 + 1) * (long)p_Var20);
    uVar90 = *(undefined8 *)*pauVar2;
    uVar91 = *(undefined8 *)(*pauVar2 + 8);
    auVar15 = *pauVar2;
    auVar12 = *pauVar2;
    auVar22 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(lVar108 + (uVar107 + 2) * (long)p_Var20);
    uVar92 = *(undefined8 *)*pauVar3;
    uVar93 = *(undefined8 *)(*pauVar3 + 8);
    auVar14 = *pauVar3;
    auVar11 = *pauVar3;
    auVar21 = *pauVar3;
    uVar111 = uVar111 - 1 & uVar111;
    pauVar4 = (undefined1 (*) [12])(lVar108 + (uVar107 + 3) * (long)p_Var20);
    uVar94 = *(undefined8 *)*pauVar4;
    uVar95 = *(undefined8 *)(*pauVar4 + 8);
    local_920 = (float)uVar94;
    fStack_91c = (float)((ulong)uVar94 >> 0x20);
    fStack_918 = (float)uVar95;
    fStack_914 = (float)((ulong)uVar95 >> 0x20);
    if (uVar111 != 0) {
      uVar109 = uVar111 - 1 & uVar111;
      for (uVar107 = uVar111; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
      }
      if (uVar109 != 0) {
        for (; (uVar109 & 1) == 0; uVar109 = uVar109 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar104 = (int)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar157 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar177 = vsubps_avx(*pauVar1,auVar157);
    uVar110 = auVar177._0_4_;
    auVar163._4_4_ = uVar110;
    auVar163._0_4_ = uVar110;
    auVar163._8_4_ = uVar110;
    auVar163._12_4_ = uVar110;
    auVar114 = vshufps_avx(auVar177,auVar177,0x55);
    auVar177 = vshufps_avx(auVar177,auVar177,0xaa);
    aVar8 = (local_6a8->vx).field_0;
    aVar9 = (local_6a8->vy).field_0;
    fVar151 = (local_6a8->vz).field_0.m128[0];
    fVar150 = *(float *)((long)&(local_6a8->vz).field_0 + 4);
    fVar185 = *(float *)((long)&(local_6a8->vz).field_0 + 8);
    fVar186 = *(float *)((long)&(local_6a8->vz).field_0 + 0xc);
    auVar191._0_4_ = fVar151 * auVar177._0_4_;
    auVar191._4_4_ = fVar150 * auVar177._4_4_;
    auVar191._8_4_ = fVar185 * auVar177._8_4_;
    auVar191._12_4_ = fVar186 * auVar177._12_4_;
    auVar114 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar9,auVar114);
    auVar191 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar8,auVar163);
    auVar114 = vblendps_avx(auVar191,*pauVar1,8);
    auVar23 = vsubps_avx(*pauVar2,auVar157);
    uVar110 = auVar23._0_4_;
    auVar192._4_4_ = uVar110;
    auVar192._0_4_ = uVar110;
    auVar192._8_4_ = uVar110;
    auVar192._12_4_ = uVar110;
    auVar177 = vshufps_avx(auVar23,auVar23,0x55);
    auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
    auVar218._0_4_ = fVar151 * auVar23._0_4_;
    auVar218._4_4_ = fVar150 * auVar23._4_4_;
    auVar218._8_4_ = fVar185 * auVar23._8_4_;
    auVar218._12_4_ = fVar186 * auVar23._12_4_;
    auVar177 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar9,auVar177);
    auVar192 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar8,auVar192);
    auVar177 = vblendps_avx(auVar192,*pauVar2,8);
    auVar163 = vsubps_avx(*pauVar3,auVar157);
    uVar110 = auVar163._0_4_;
    auVar198._4_4_ = uVar110;
    auVar198._0_4_ = uVar110;
    auVar198._8_4_ = uVar110;
    auVar198._12_4_ = uVar110;
    auVar23 = vshufps_avx(auVar163,auVar163,0x55);
    auVar163 = vshufps_avx(auVar163,auVar163,0xaa);
    auVar226._0_4_ = fVar151 * auVar163._0_4_;
    auVar226._4_4_ = fVar150 * auVar163._4_4_;
    auVar226._8_4_ = fVar185 * auVar163._8_4_;
    auVar226._12_4_ = fVar186 * auVar163._12_4_;
    auVar23 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar9,auVar23);
    auVar198 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar8,auVar198);
    auVar23 = vblendps_avx(auVar198,*pauVar3,8);
    auVar28._12_4_ = fStack_914;
    auVar28._0_12_ = *pauVar4;
    auVar163 = vsubps_avx(auVar28,auVar157);
    uVar110 = auVar163._0_4_;
    auVar199._4_4_ = uVar110;
    auVar199._0_4_ = uVar110;
    auVar199._8_4_ = uVar110;
    auVar199._12_4_ = uVar110;
    auVar157 = vshufps_avx(auVar163,auVar163,0x55);
    auVar163 = vshufps_avx(auVar163,auVar163,0xaa);
    auVar228._0_4_ = fVar151 * auVar163._0_4_;
    auVar228._4_4_ = fVar150 * auVar163._4_4_;
    auVar228._8_4_ = fVar185 * auVar163._8_4_;
    auVar228._12_4_ = fVar186 * auVar163._12_4_;
    auVar157 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar9,auVar157);
    auVar199 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar8,auVar199);
    auVar115._8_4_ = 0x7fffffff;
    auVar115._0_8_ = 0x7fffffff7fffffff;
    auVar115._12_4_ = 0x7fffffff;
    auVar157 = vblendps_avx(auVar199,auVar28,8);
    auVar114 = vandps_avx(auVar114,auVar115);
    auVar177 = vandps_avx(auVar177,auVar115);
    auVar163 = vmaxps_avx(auVar114,auVar177);
    auVar114 = vandps_avx(auVar23,auVar115);
    auVar177 = vandps_avx(auVar157,auVar115);
    auVar114 = vmaxps_avx(auVar114,auVar177);
    auVar114 = vmaxps_avx(auVar163,auVar114);
    auVar177 = vmovshdup_avx(auVar114);
    auVar177 = vmaxss_avx(auVar177,auVar114);
    auVar114 = vshufpd_avx(auVar114,auVar114,1);
    auVar114 = vmaxss_avx(auVar114,auVar177);
    lVar108 = (long)iVar104 * 0x44;
    auVar177 = vmovshdup_avx(auVar191);
    local_620 = auVar177._0_8_;
    auVar220 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 + 0x484);
    auVar177 = vmovshdup_avx(auVar192);
    uVar113 = auVar177._0_8_;
    local_4e0._8_8_ = uVar113;
    local_4e0._0_8_ = uVar113;
    local_4e0._16_8_ = uVar113;
    local_4e0._24_8_ = uVar113;
    auVar184 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 + 0x908);
    uVar225 = auVar198._0_4_;
    local_720._4_4_ = uVar225;
    local_720._0_4_ = uVar225;
    local_720._8_4_ = uVar225;
    local_720._12_4_ = uVar225;
    local_720._16_4_ = uVar225;
    local_720._20_4_ = uVar225;
    local_720._24_4_ = uVar225;
    local_720._28_4_ = uVar225;
    auVar177 = vmovshdup_avx(auVar198);
    uVar113 = auVar177._0_8_;
    local_640._8_8_ = uVar113;
    local_640._0_8_ = uVar113;
    local_640._16_8_ = uVar113;
    local_640._24_8_ = uVar113;
    fVar150 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar108 + 0xd8c);
    fVar185 = *(float *)(catmullrom_basis0 + lVar108 + 0xd90);
    fVar186 = *(float *)(catmullrom_basis0 + lVar108 + 0xd94);
    fVar187 = *(float *)(catmullrom_basis0 + lVar108 + 0xd98);
    fVar188 = *(float *)(catmullrom_basis0 + lVar108 + 0xd9c);
    fVar189 = *(float *)(catmullrom_basis0 + lVar108 + 0xda0);
    fVar190 = *(float *)(catmullrom_basis0 + lVar108 + 0xda4);
    auVar102 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar108 + 0xd8c);
    local_4c0 = auVar199._0_4_;
    auVar177 = vmovshdup_avx(auVar199);
    local_760 = auVar177._0_8_;
    auVar193._0_4_ = fVar150 * local_4c0;
    auVar193._4_4_ = fVar185 * local_4c0;
    auVar193._8_4_ = fVar186 * local_4c0;
    auVar193._12_4_ = fVar187 * local_4c0;
    auVar193._16_4_ = fVar188 * local_4c0;
    auVar193._20_4_ = fVar189 * local_4c0;
    auVar193._24_4_ = fVar190 * local_4c0;
    auVar193._28_4_ = 0;
    fVar234 = auVar177._0_4_;
    auVar120._0_4_ = fVar234 * fVar150;
    fVar239 = auVar177._4_4_;
    auVar120._4_4_ = fVar239 * fVar185;
    auVar120._8_4_ = fVar234 * fVar186;
    auVar120._12_4_ = fVar239 * fVar187;
    auVar120._16_4_ = fVar234 * fVar188;
    auVar120._20_4_ = fVar239 * fVar189;
    auVar120._24_4_ = fVar234 * fVar190;
    auVar120._28_4_ = 0;
    auVar177 = vfmadd231ps_fma(auVar193,auVar184,local_720);
    auVar23 = vfmadd231ps_fma(auVar120,auVar184,local_640);
    uVar110 = auVar192._0_4_;
    auVar246._4_4_ = uVar110;
    auVar246._0_4_ = uVar110;
    auVar246._8_4_ = uVar110;
    auVar246._12_4_ = uVar110;
    auVar246._16_4_ = uVar110;
    auVar246._20_4_ = uVar110;
    auVar246._24_4_ = uVar110;
    auVar246._28_4_ = uVar110;
    auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar220,auVar246);
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar220,local_4e0);
    auVar130 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108);
    uVar110 = auVar191._0_4_;
    auVar240._4_4_ = uVar110;
    auVar240._0_4_ = uVar110;
    auVar240._8_4_ = uVar110;
    auVar240._12_4_ = uVar110;
    auVar240._16_4_ = uVar110;
    auVar240._20_4_ = uVar110;
    auVar240._24_4_ = uVar110;
    auVar240._28_4_ = uVar110;
    auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar130,auVar240);
    auVar96._8_8_ = local_620;
    auVar96._0_8_ = local_620;
    auVar96._16_8_ = local_620;
    auVar96._24_8_ = local_620;
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar130,auVar96);
    auVar139 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 + 0x908);
    fVar205 = *(float *)(catmullrom_basis1 + lVar108 + 0xd8c);
    fVar206 = *(float *)(catmullrom_basis1 + lVar108 + 0xd90);
    fVar207 = *(float *)(catmullrom_basis1 + lVar108 + 0xd94);
    fVar222 = *(float *)(catmullrom_basis1 + lVar108 + 0xd98);
    fVar223 = *(float *)(catmullrom_basis1 + lVar108 + 0xd9c);
    fVar224 = *(float *)(catmullrom_basis1 + lVar108 + 0xda0);
    fVar88 = *(float *)(catmullrom_basis1 + lVar108 + 0xda4);
    auVar29._4_4_ = fVar206 * local_4c0;
    auVar29._0_4_ = fVar205 * local_4c0;
    auVar29._8_4_ = fVar207 * local_4c0;
    auVar29._12_4_ = fVar222 * local_4c0;
    auVar29._16_4_ = fVar223 * local_4c0;
    auVar29._20_4_ = fVar224 * local_4c0;
    auVar29._24_4_ = fVar88 * local_4c0;
    auVar29._28_4_ = local_4c0;
    auVar157 = vfmadd231ps_fma(auVar29,auVar139,local_720);
    auVar30._4_4_ = fVar239 * fVar206;
    auVar30._0_4_ = fVar234 * fVar205;
    auVar30._8_4_ = fVar234 * fVar207;
    auVar30._12_4_ = fVar239 * fVar222;
    auVar30._16_4_ = fVar234 * fVar223;
    auVar30._20_4_ = fVar239 * fVar224;
    auVar30._24_4_ = fVar234 * fVar88;
    auVar30._28_4_ = uVar225;
    auVar163 = vfmadd231ps_fma(auVar30,auVar139,local_640);
    auVar180 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 + 0x484);
    auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar180,auVar246);
    auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar180,local_4e0);
    auVar25 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108);
    auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar25,auVar240);
    auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar25,auVar96);
    _local_5a0 = ZEXT1632(auVar157);
    local_500 = ZEXT1632(auVar177);
    auVar27 = vsubps_avx(_local_5a0,local_500);
    auVar237 = ZEXT3264(auVar27);
    local_440 = ZEXT1632(auVar163);
    auVar121 = ZEXT1632(auVar23);
    auVar129 = vsubps_avx(local_440,auVar121);
    auVar122._0_4_ = auVar27._0_4_ * auVar23._0_4_;
    auVar122._4_4_ = auVar27._4_4_ * auVar23._4_4_;
    auVar122._8_4_ = auVar27._8_4_ * auVar23._8_4_;
    auVar122._12_4_ = auVar27._12_4_ * auVar23._12_4_;
    auVar122._16_4_ = auVar27._16_4_ * 0.0;
    auVar122._20_4_ = auVar27._20_4_ * 0.0;
    auVar122._24_4_ = auVar27._24_4_ * 0.0;
    auVar122._28_4_ = 0;
    fVar227 = auVar129._0_4_;
    auVar135._0_4_ = fVar227 * auVar177._0_4_;
    fVar233 = auVar129._4_4_;
    auVar135._4_4_ = fVar233 * auVar177._4_4_;
    fVar242 = auVar129._8_4_;
    auVar135._8_4_ = fVar242 * auVar177._8_4_;
    fVar243 = auVar129._12_4_;
    auVar135._12_4_ = fVar243 * auVar177._12_4_;
    fVar208 = auVar129._16_4_;
    auVar135._16_4_ = fVar208 * 0.0;
    fVar212 = auVar129._20_4_;
    auVar135._20_4_ = fVar212 * 0.0;
    fVar213 = auVar129._24_4_;
    auVar135._24_4_ = fVar213 * 0.0;
    auVar135._28_4_ = 0;
    auVar24 = vsubps_avx(auVar122,auVar135);
    auVar177 = vpermilps_avx(*pauVar1,0xff);
    uVar113 = auVar177._0_8_;
    local_a0._8_8_ = uVar113;
    local_a0._0_8_ = uVar113;
    local_a0._16_8_ = uVar113;
    local_a0._24_8_ = uVar113;
    auVar23 = vpermilps_avx(*pauVar2,0xff);
    uVar113 = auVar23._0_8_;
    local_c0._8_8_ = uVar113;
    local_c0._0_8_ = uVar113;
    local_c0._16_8_ = uVar113;
    local_c0._24_8_ = uVar113;
    auVar23 = vpermilps_avx(*pauVar3,0xff);
    uVar113 = auVar23._0_8_;
    local_e0._8_8_ = uVar113;
    local_e0._0_8_ = uVar113;
    local_e0._16_8_ = uVar113;
    local_e0._24_8_ = uVar113;
    auVar23._12_4_ = fStack_914;
    auVar23._0_12_ = *pauVar4;
    auVar23 = vpermilps_avx(auVar23,0xff);
    local_100 = auVar23._0_8_;
    fVar151 = auVar23._0_4_;
    auVar194._0_4_ = fVar150 * fVar151;
    fVar150 = auVar23._4_4_;
    auVar194._4_4_ = fVar185 * fVar150;
    auVar194._8_4_ = fVar186 * fVar151;
    auVar194._12_4_ = fVar187 * fVar150;
    auVar194._16_4_ = fVar188 * fVar151;
    auVar194._20_4_ = fVar189 * fVar150;
    auVar194._24_4_ = fVar190 * fVar151;
    auVar194._28_4_ = 0;
    auVar23 = vfmadd231ps_fma(auVar194,local_e0,auVar184);
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_c0,auVar220);
    auVar163 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar130,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar31._4_4_ = fVar206 * fVar150;
    auVar31._0_4_ = fVar205 * fVar151;
    auVar31._8_4_ = fVar207 * fVar151;
    auVar31._12_4_ = fVar222 * fVar150;
    auVar31._16_4_ = fVar223 * fVar151;
    auVar31._20_4_ = fVar224 * fVar150;
    auVar31._24_4_ = fVar88 * fVar151;
    auVar31._28_4_ = auVar130._28_4_;
    auVar23 = vfmadd231ps_fma(auVar31,auVar139,local_e0);
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar180,local_c0);
    auVar28 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar25,local_a0);
    auVar32._4_4_ = fVar233 * fVar233;
    auVar32._0_4_ = fVar227 * fVar227;
    auVar32._8_4_ = fVar242 * fVar242;
    auVar32._12_4_ = fVar243 * fVar243;
    auVar32._16_4_ = fVar208 * fVar208;
    auVar32._20_4_ = fVar212 * fVar212;
    auVar32._24_4_ = fVar213 * fVar213;
    auVar32._28_4_ = auVar177._4_4_;
    auVar177 = vfmadd231ps_fma(auVar32,auVar27,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar163),ZEXT1632(auVar28));
    auVar33._4_4_ = auVar26._4_4_ * auVar26._4_4_ * auVar177._4_4_;
    auVar33._0_4_ = auVar26._0_4_ * auVar26._0_4_ * auVar177._0_4_;
    auVar33._8_4_ = auVar26._8_4_ * auVar26._8_4_ * auVar177._8_4_;
    auVar33._12_4_ = auVar26._12_4_ * auVar26._12_4_ * auVar177._12_4_;
    auVar33._16_4_ = auVar26._16_4_ * auVar26._16_4_ * 0.0;
    auVar33._20_4_ = auVar26._20_4_ * auVar26._20_4_ * 0.0;
    auVar33._24_4_ = auVar26._24_4_ * auVar26._24_4_ * 0.0;
    auVar33._28_4_ = auVar26._28_4_;
    auVar34._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar34._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar34._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar34._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar34._16_4_ = auVar24._16_4_ * auVar24._16_4_;
    auVar34._20_4_ = auVar24._20_4_ * auVar24._20_4_;
    auVar34._24_4_ = auVar24._24_4_ * auVar24._24_4_;
    auVar34._28_4_ = auVar24._28_4_;
    local_520._0_4_ = (undefined4)iVar104;
    local_520._4_12_ = auVar198._4_12_;
    auVar26 = vcmpps_avx(auVar34,auVar33,2);
    fVar151 = auVar114._0_4_ * 4.7683716e-07;
    local_520._16_16_ = auVar119._16_16_;
    auVar123._4_4_ = local_520._0_4_;
    auVar123._0_4_ = local_520._0_4_;
    auVar123._8_4_ = local_520._0_4_;
    auVar123._12_4_ = local_520._0_4_;
    auVar123._16_4_ = local_520._0_4_;
    auVar123._20_4_ = local_520._0_4_;
    auVar123._24_4_ = local_520._0_4_;
    auVar123._28_4_ = local_520._0_4_;
    auVar119 = vcmpps_avx(_DAT_01f7b060,auVar123,1);
    auVar23 = vpermilps_avx(auVar191,0xaa);
    uVar113 = auVar23._0_8_;
    local_660._8_8_ = uVar113;
    local_660._0_8_ = uVar113;
    local_660._16_8_ = uVar113;
    local_660._24_8_ = uVar113;
    auVar157 = vpermilps_avx(auVar192,0xaa);
    uVar113 = auVar157._0_8_;
    auVar203._8_8_ = uVar113;
    auVar203._0_8_ = uVar113;
    auVar203._16_8_ = uVar113;
    auVar203._24_8_ = uVar113;
    auVar114 = vshufps_avx(auVar198,auVar198,0xaa);
    uVar113 = auVar114._0_8_;
    auVar247._8_8_ = uVar113;
    auVar247._0_8_ = uVar113;
    auVar247._16_8_ = uVar113;
    auVar247._24_8_ = uVar113;
    auVar177 = vshufps_avx(auVar199,auVar199,0xaa);
    uVar113 = auVar177._0_8_;
    register0x00001508 = uVar113;
    local_780 = uVar113;
    register0x00001510 = uVar113;
    register0x00001518 = uVar113;
    auVar231 = ZEXT3264(_local_780);
    auVar24 = auVar119 & auVar26;
    uVar7 = *(uint *)(ray + k * 4 + 0x60);
    local_680._0_16_ = ZEXT416(uVar7);
    local_540._0_16_ = ZEXT416(uVar105);
    local_560 = ZEXT416(uVar18);
    uStack_758 = local_760;
    uStack_750 = local_760;
    uStack_748 = local_760;
    uStack_618 = local_620;
    uStack_610 = local_620;
    uStack_608 = local_620;
    fStack_4bc = local_4c0;
    fStack_4b8 = local_4c0;
    fStack_4b4 = local_4c0;
    fStack_4b0 = local_4c0;
    fStack_4ac = local_4c0;
    fStack_4a8 = local_4c0;
    fStack_4a4 = local_4c0;
    local_560._0_4_ = uVar18;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0x7f,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar24 >> 0xbf,0) == '\0') &&
        (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f]) {
      auVar149 = ZEXT3264(local_7c0);
      auVar170 = ZEXT3264(local_720);
    }
    else {
      _local_460 = vandps_avx(auVar26,auVar119);
      fVar227 = auVar177._0_4_;
      fVar233 = auVar177._4_4_;
      auVar35._4_4_ = fVar233 * fVar206;
      auVar35._0_4_ = fVar227 * fVar205;
      auVar35._8_4_ = fVar227 * fVar207;
      auVar35._12_4_ = fVar233 * fVar222;
      auVar35._16_4_ = fVar227 * fVar223;
      auVar35._20_4_ = fVar233 * fVar224;
      auVar35._24_4_ = fVar227 * fVar88;
      auVar35._28_4_ = local_460._28_4_;
      auVar177 = vfmadd213ps_fma(auVar139,auVar247,auVar35);
      auVar177 = vfmadd213ps_fma(auVar180,auVar203,ZEXT1632(auVar177));
      auVar177 = vfmadd213ps_fma(auVar25,local_660,ZEXT1632(auVar177));
      local_5c0._0_4_ = auVar102._0_4_;
      local_5c0._4_4_ = auVar102._4_4_;
      fStack_5b8 = auVar102._8_4_;
      fStack_5b4 = auVar102._12_4_;
      fStack_5b0 = auVar102._16_4_;
      fStack_5ac = auVar102._20_4_;
      fStack_5a8 = auVar102._24_4_;
      auVar124._0_4_ = fVar227 * (float)local_5c0._0_4_;
      auVar124._4_4_ = fVar233 * (float)local_5c0._4_4_;
      auVar124._8_4_ = fVar227 * fStack_5b8;
      auVar124._12_4_ = fVar233 * fStack_5b4;
      auVar124._16_4_ = fVar227 * fStack_5b0;
      auVar124._20_4_ = fVar233 * fStack_5ac;
      auVar124._24_4_ = fVar227 * fStack_5a8;
      auVar124._28_4_ = 0;
      auVar191 = vfmadd213ps_fma(auVar184,auVar247,auVar124);
      auVar191 = vfmadd213ps_fma(auVar220,auVar203,ZEXT1632(auVar191));
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 + 0x1210);
      auVar220 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 + 0x1694);
      auVar184 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar108 + 0x1b18);
      fVar150 = *(float *)(catmullrom_basis0 + lVar108 + 0x1f9c);
      fVar185 = *(float *)(catmullrom_basis0 + lVar108 + 0x1fa0);
      fVar186 = *(float *)(catmullrom_basis0 + lVar108 + 0x1fa4);
      fVar187 = *(float *)(catmullrom_basis0 + lVar108 + 0x1fa8);
      fVar188 = *(float *)(catmullrom_basis0 + lVar108 + 0x1fac);
      fVar189 = *(float *)(catmullrom_basis0 + lVar108 + 0x1fb0);
      fVar190 = *(float *)(catmullrom_basis0 + lVar108 + 0x1fb4);
      auVar179._0_4_ = local_4c0 * fVar150;
      auVar179._4_4_ = local_4c0 * fVar185;
      auVar179._8_4_ = local_4c0 * fVar186;
      auVar179._12_4_ = local_4c0 * fVar187;
      auVar179._16_4_ = local_4c0 * fVar188;
      auVar179._20_4_ = local_4c0 * fVar189;
      auVar179._24_4_ = local_4c0 * fVar190;
      auVar179._28_4_ = 0;
      auVar36._4_4_ = fVar239 * fVar185;
      auVar36._0_4_ = fVar234 * fVar150;
      auVar36._8_4_ = fVar234 * fVar186;
      auVar36._12_4_ = fVar239 * fVar187;
      auVar36._16_4_ = fVar234 * fVar188;
      auVar36._20_4_ = fVar239 * fVar189;
      auVar36._24_4_ = fVar234 * fVar190;
      auVar36._28_4_ = auVar157._4_4_;
      auVar37._4_4_ = fVar233 * fVar185;
      auVar37._0_4_ = fVar227 * fVar150;
      auVar37._8_4_ = fVar227 * fVar186;
      auVar37._12_4_ = fVar233 * fVar187;
      auVar37._16_4_ = fVar227 * fVar188;
      auVar37._20_4_ = fVar233 * fVar189;
      auVar37._24_4_ = fVar227 * fVar190;
      auVar37._28_4_ = *(undefined4 *)(catmullrom_basis1 + lVar108 + 0xda8);
      auVar157 = vfmadd231ps_fma(auVar179,auVar184,local_720);
      auVar192 = vfmadd231ps_fma(auVar36,auVar184,local_640);
      auVar198 = vfmadd231ps_fma(auVar37,auVar247,auVar184);
      auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar220,auVar246);
      auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar220,local_4e0);
      auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar220,auVar203);
      auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar119,auVar240);
      auVar97._8_8_ = local_620;
      auVar97._0_8_ = local_620;
      auVar97._16_8_ = local_620;
      auVar97._24_8_ = local_620;
      auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar119,auVar97);
      auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),local_660,auVar119);
      fVar150 = *(float *)(catmullrom_basis1 + lVar108 + 0x1f9c);
      fVar185 = *(float *)(catmullrom_basis1 + lVar108 + 0x1fa0);
      fVar186 = *(float *)(catmullrom_basis1 + lVar108 + 0x1fa4);
      fVar187 = *(float *)(catmullrom_basis1 + lVar108 + 0x1fa8);
      fVar188 = *(float *)(catmullrom_basis1 + lVar108 + 0x1fac);
      fVar189 = *(float *)(catmullrom_basis1 + lVar108 + 0x1fb0);
      fVar190 = *(float *)(catmullrom_basis1 + lVar108 + 0x1fb4);
      auVar220._4_4_ = local_4c0 * fVar185;
      auVar220._0_4_ = local_4c0 * fVar150;
      auVar220._8_4_ = local_4c0 * fVar186;
      auVar220._12_4_ = local_4c0 * fVar187;
      auVar220._16_4_ = local_4c0 * fVar188;
      auVar220._20_4_ = local_4c0 * fVar189;
      auVar220._24_4_ = local_4c0 * fVar190;
      auVar220._28_4_ = local_4c0;
      auVar38._4_4_ = fVar239 * fVar185;
      auVar38._0_4_ = fVar234 * fVar150;
      auVar38._8_4_ = fVar234 * fVar186;
      auVar38._12_4_ = fVar239 * fVar187;
      auVar38._16_4_ = fVar234 * fVar188;
      auVar38._20_4_ = fVar239 * fVar189;
      auVar38._24_4_ = fVar234 * fVar190;
      auVar38._28_4_ = auVar114._4_4_;
      auVar39._4_4_ = fVar185 * fVar233;
      auVar39._0_4_ = fVar150 * fVar227;
      auVar39._8_4_ = fVar186 * fVar227;
      auVar39._12_4_ = fVar187 * fVar233;
      auVar39._16_4_ = fVar188 * fVar227;
      auVar39._20_4_ = fVar189 * fVar233;
      auVar39._24_4_ = fVar190 * fVar227;
      auVar39._28_4_ = auVar23._4_4_;
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 + 0x1b18);
      auVar114 = vfmadd231ps_fma(auVar220,auVar119,local_720);
      auVar23 = vfmadd231ps_fma(auVar38,auVar119,local_640);
      auVar199 = vfmadd231ps_fma(auVar39,auVar247,auVar119);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 + 0x1694);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar119,auVar246);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar119,local_4e0);
      auVar199 = vfmadd231ps_fma(ZEXT1632(auVar199),auVar203,auVar119);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar108 + 0x1210);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar119,auVar240);
      auVar98._8_8_ = local_620;
      auVar98._0_8_ = local_620;
      auVar98._16_8_ = local_620;
      auVar98._24_8_ = local_620;
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar119,auVar98);
      auVar199 = vfmadd231ps_fma(ZEXT1632(auVar199),local_660,auVar119);
      auVar119 = vandps_avx(local_2c0,ZEXT1632(auVar157));
      auVar220 = vandps_avx(ZEXT1632(auVar192),local_2c0);
      auVar220 = vmaxps_avx(auVar119,auVar220);
      auVar119 = vandps_avx(ZEXT1632(auVar198),local_2c0);
      auVar119 = vmaxps_avx(auVar220,auVar119);
      auVar136._4_4_ = fVar151;
      auVar136._0_4_ = fVar151;
      auVar136._8_4_ = fVar151;
      auVar136._12_4_ = fVar151;
      auVar136._16_4_ = fVar151;
      auVar136._20_4_ = fVar151;
      auVar136._24_4_ = fVar151;
      auVar136._28_4_ = fVar151;
      auVar119 = vcmpps_avx(auVar119,auVar136,1);
      auVar184 = vblendvps_avx(ZEXT1632(auVar157),auVar27,auVar119);
      auVar139 = vblendvps_avx(ZEXT1632(auVar192),auVar129,auVar119);
      auVar119 = vandps_avx(ZEXT1632(auVar114),local_2c0);
      auVar220 = vandps_avx(ZEXT1632(auVar23),local_2c0);
      auVar220 = vmaxps_avx(auVar119,auVar220);
      auVar119 = vandps_avx(ZEXT1632(auVar199),local_2c0);
      auVar119 = vmaxps_avx(auVar220,auVar119);
      auVar220 = vcmpps_avx(auVar119,auVar136,1);
      auVar119 = vblendvps_avx(ZEXT1632(auVar114),auVar27,auVar220);
      auVar220 = vblendvps_avx(ZEXT1632(auVar23),auVar129,auVar220);
      auVar114 = vfmadd213ps_fma(auVar130,local_660,ZEXT1632(auVar191));
      auVar23 = vfmadd213ps_fma(auVar184,auVar184,ZEXT832(0) << 0x20);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar139,auVar139);
      auVar130 = vrsqrtps_avx(ZEXT1632(auVar23));
      fVar150 = auVar130._0_4_;
      fVar185 = auVar130._4_4_;
      fVar186 = auVar130._8_4_;
      fVar187 = auVar130._12_4_;
      fVar188 = auVar130._16_4_;
      fVar189 = auVar130._20_4_;
      fVar190 = auVar130._24_4_;
      auVar40._4_4_ = fVar185 * fVar185 * fVar185 * auVar23._4_4_ * -0.5;
      auVar40._0_4_ = fVar150 * fVar150 * fVar150 * auVar23._0_4_ * -0.5;
      auVar40._8_4_ = fVar186 * fVar186 * fVar186 * auVar23._8_4_ * -0.5;
      auVar40._12_4_ = fVar187 * fVar187 * fVar187 * auVar23._12_4_ * -0.5;
      auVar40._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
      auVar40._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
      auVar40._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
      auVar40._28_4_ = 0;
      auVar241._8_4_ = 0x3fc00000;
      auVar241._0_8_ = 0x3fc000003fc00000;
      auVar241._12_4_ = 0x3fc00000;
      auVar241._16_4_ = 0x3fc00000;
      auVar241._20_4_ = 0x3fc00000;
      auVar241._24_4_ = 0x3fc00000;
      auVar241._28_4_ = 0x3fc00000;
      auVar23 = vfmadd231ps_fma(auVar40,auVar241,auVar130);
      fVar150 = auVar23._0_4_;
      fVar185 = auVar23._4_4_;
      auVar41._4_4_ = auVar139._4_4_ * fVar185;
      auVar41._0_4_ = auVar139._0_4_ * fVar150;
      fVar186 = auVar23._8_4_;
      auVar41._8_4_ = auVar139._8_4_ * fVar186;
      fVar187 = auVar23._12_4_;
      auVar41._12_4_ = auVar139._12_4_ * fVar187;
      auVar41._16_4_ = auVar139._16_4_ * 0.0;
      auVar41._20_4_ = auVar139._20_4_ * 0.0;
      auVar41._24_4_ = auVar139._24_4_ * 0.0;
      auVar41._28_4_ = auVar130._28_4_;
      auVar42._4_4_ = -auVar184._4_4_ * fVar185;
      auVar42._0_4_ = -auVar184._0_4_ * fVar150;
      auVar42._8_4_ = -auVar184._8_4_ * fVar186;
      auVar42._12_4_ = -auVar184._12_4_ * fVar187;
      auVar42._16_4_ = -auVar184._16_4_ * 0.0;
      auVar42._20_4_ = -auVar184._20_4_ * 0.0;
      auVar42._24_4_ = -auVar184._24_4_ * 0.0;
      auVar42._28_4_ = auVar184._28_4_ ^ 0x80000000;
      auVar23 = vfmadd213ps_fma(auVar119,auVar119,ZEXT832(0) << 0x20);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar220,auVar220);
      auVar184 = vrsqrtps_avx(ZEXT1632(auVar23));
      auVar130 = ZEXT1632(CONCAT412(fVar187 * 0.0,
                                    CONCAT48(fVar186 * 0.0,CONCAT44(fVar185 * 0.0,fVar150 * 0.0))));
      fVar150 = auVar184._0_4_;
      fVar185 = auVar184._4_4_;
      fVar186 = auVar184._8_4_;
      fVar187 = auVar184._12_4_;
      fVar188 = auVar184._16_4_;
      fVar189 = auVar184._20_4_;
      fVar190 = auVar184._24_4_;
      auVar43._4_4_ = fVar185 * fVar185 * auVar23._4_4_ * -0.5 * fVar185;
      auVar43._0_4_ = fVar150 * fVar150 * auVar23._0_4_ * -0.5 * fVar150;
      auVar43._8_4_ = fVar186 * fVar186 * auVar23._8_4_ * -0.5 * fVar186;
      auVar43._12_4_ = fVar187 * fVar187 * auVar23._12_4_ * -0.5 * fVar187;
      auVar43._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
      auVar43._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
      auVar43._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
      auVar43._28_4_ = 0xbf000000;
      auVar23 = vfmadd231ps_fma(auVar43,auVar241,auVar184);
      fVar150 = auVar23._0_4_;
      fVar185 = auVar23._4_4_;
      auVar44._4_4_ = fVar185 * auVar220._4_4_;
      auVar44._0_4_ = fVar150 * auVar220._0_4_;
      fVar186 = auVar23._8_4_;
      auVar44._8_4_ = fVar186 * auVar220._8_4_;
      fVar187 = auVar23._12_4_;
      auVar44._12_4_ = fVar187 * auVar220._12_4_;
      auVar44._16_4_ = auVar220._16_4_ * 0.0;
      auVar44._20_4_ = auVar220._20_4_ * 0.0;
      auVar44._24_4_ = auVar220._24_4_ * 0.0;
      auVar44._28_4_ = 0;
      auVar45._4_4_ = fVar185 * -auVar119._4_4_;
      auVar45._0_4_ = fVar150 * -auVar119._0_4_;
      auVar45._8_4_ = fVar186 * -auVar119._8_4_;
      auVar45._12_4_ = fVar187 * -auVar119._12_4_;
      auVar45._16_4_ = -auVar119._16_4_ * 0.0;
      auVar45._20_4_ = -auVar119._20_4_ * 0.0;
      auVar45._24_4_ = -auVar119._24_4_ * 0.0;
      auVar45._28_4_ = 0;
      auVar46._28_4_ = auVar184._28_4_;
      auVar46._0_28_ =
           ZEXT1628(CONCAT412(fVar187 * 0.0,
                              CONCAT48(fVar186 * 0.0,CONCAT44(fVar185 * 0.0,fVar150 * 0.0))));
      auVar23 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar163),local_500);
      auVar119 = ZEXT1632(auVar163);
      auVar157 = vfmadd213ps_fma(auVar42,auVar119,auVar121);
      auVar191 = vfmadd213ps_fma(auVar130,auVar119,ZEXT1632(auVar114));
      auVar199 = vfnmadd213ps_fma(auVar41,auVar119,local_500);
      auVar192 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar28),_local_5a0);
      auVar115 = vfnmadd213ps_fma(auVar42,auVar119,auVar121);
      auVar119 = ZEXT1632(auVar28);
      auVar198 = vfmadd213ps_fma(auVar45,auVar119,local_440);
      auVar195 = ZEXT1632(auVar163);
      auVar228 = vfnmadd231ps_fma(ZEXT1632(auVar114),auVar195,auVar130);
      auVar163 = vfmadd213ps_fma(auVar46,auVar119,ZEXT1632(auVar177));
      auVar218 = vfnmadd213ps_fma(auVar44,auVar119,_local_5a0);
      auVar226 = vfnmadd213ps_fma(auVar45,auVar119,local_440);
      local_580 = ZEXT1632(auVar28);
      auVar28 = vfnmadd231ps_fma(ZEXT1632(auVar177),local_580,auVar46);
      auVar119 = vsubps_avx(ZEXT1632(auVar198),ZEXT1632(auVar115));
      auVar220 = vsubps_avx(ZEXT1632(auVar163),ZEXT1632(auVar228));
      auVar159._0_4_ = auVar228._0_4_ * auVar119._0_4_;
      auVar159._4_4_ = auVar228._4_4_ * auVar119._4_4_;
      auVar159._8_4_ = auVar228._8_4_ * auVar119._8_4_;
      auVar159._12_4_ = auVar228._12_4_ * auVar119._12_4_;
      auVar159._16_4_ = auVar119._16_4_ * 0.0;
      auVar159._20_4_ = auVar119._20_4_ * 0.0;
      auVar159._24_4_ = auVar119._24_4_ * 0.0;
      auVar159._28_4_ = 0;
      auVar177 = vfmsub231ps_fma(auVar159,ZEXT1632(auVar115),auVar220);
      auVar47._4_4_ = auVar220._4_4_ * auVar199._4_4_;
      auVar47._0_4_ = auVar220._0_4_ * auVar199._0_4_;
      auVar47._8_4_ = auVar220._8_4_ * auVar199._8_4_;
      auVar47._12_4_ = auVar220._12_4_ * auVar199._12_4_;
      auVar47._16_4_ = auVar220._16_4_ * 0.0;
      auVar47._20_4_ = auVar220._20_4_ * 0.0;
      auVar47._24_4_ = auVar220._24_4_ * 0.0;
      auVar47._28_4_ = auVar220._28_4_;
      auVar220 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar199));
      auVar114 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar228),auVar220);
      auVar48._4_4_ = auVar115._4_4_ * auVar220._4_4_;
      auVar48._0_4_ = auVar115._0_4_ * auVar220._0_4_;
      auVar48._8_4_ = auVar115._8_4_ * auVar220._8_4_;
      auVar48._12_4_ = auVar115._12_4_ * auVar220._12_4_;
      auVar48._16_4_ = auVar220._16_4_ * 0.0;
      auVar48._20_4_ = auVar220._20_4_ * 0.0;
      auVar48._24_4_ = auVar220._24_4_ * 0.0;
      auVar48._28_4_ = auVar220._28_4_;
      auVar180 = ZEXT1632(auVar199);
      auVar199 = vfmsub231ps_fma(auVar48,auVar180,auVar119);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar199),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT832(0) << 0x20,ZEXT1632(auVar177));
      auVar27 = vcmpps_avx(ZEXT1632(auVar114),ZEXT832(0) << 0x20,2);
      auVar119 = vblendvps_avx(ZEXT1632(auVar218),ZEXT1632(auVar23),auVar27);
      auVar220 = vblendvps_avx(ZEXT1632(auVar226),ZEXT1632(auVar157),auVar27);
      auVar219 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar191),auVar27);
      auVar184 = vblendvps_avx(auVar180,ZEXT1632(auVar192),auVar27);
      auVar130 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar198),auVar27);
      auVar139 = vblendvps_avx(ZEXT1632(auVar228),ZEXT1632(auVar163),auVar27);
      auVar180 = vblendvps_avx(ZEXT1632(auVar192),auVar180,auVar27);
      auVar25 = vblendvps_avx(ZEXT1632(auVar198),ZEXT1632(auVar115),auVar27);
      auVar114 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
      auVar26 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar228),auVar27);
      auVar24 = vsubps_avx(auVar180,auVar119);
      auVar121 = vsubps_avx(auVar25,auVar220);
      auVar158 = vsubps_avx(auVar26,auVar219);
      auVar178 = vsubps_avx(auVar119,auVar184);
      auVar200 = vsubps_avx(auVar220,auVar130);
      auVar201 = vsubps_avx(auVar219,auVar139);
      auVar49._4_4_ = auVar158._4_4_ * auVar119._4_4_;
      auVar49._0_4_ = auVar158._0_4_ * auVar119._0_4_;
      auVar49._8_4_ = auVar158._8_4_ * auVar119._8_4_;
      auVar49._12_4_ = auVar158._12_4_ * auVar119._12_4_;
      auVar49._16_4_ = auVar158._16_4_ * auVar119._16_4_;
      auVar49._20_4_ = auVar158._20_4_ * auVar119._20_4_;
      auVar49._24_4_ = auVar158._24_4_ * auVar119._24_4_;
      auVar49._28_4_ = auVar26._28_4_;
      auVar177 = vfmsub231ps_fma(auVar49,auVar219,auVar24);
      auVar50._4_4_ = auVar220._4_4_ * auVar24._4_4_;
      auVar50._0_4_ = auVar220._0_4_ * auVar24._0_4_;
      auVar50._8_4_ = auVar220._8_4_ * auVar24._8_4_;
      auVar50._12_4_ = auVar220._12_4_ * auVar24._12_4_;
      auVar50._16_4_ = auVar220._16_4_ * auVar24._16_4_;
      auVar50._20_4_ = auVar220._20_4_ * auVar24._20_4_;
      auVar50._24_4_ = auVar220._24_4_ * auVar24._24_4_;
      auVar50._28_4_ = auVar180._28_4_;
      auVar23 = vfmsub231ps_fma(auVar50,auVar119,auVar121);
      auVar149 = ZEXT864(0) << 0x20;
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar177));
      fVar150 = auVar219._0_4_;
      auVar125._0_4_ = auVar121._0_4_ * fVar150;
      fVar185 = auVar219._4_4_;
      auVar125._4_4_ = auVar121._4_4_ * fVar185;
      fVar186 = auVar219._8_4_;
      auVar125._8_4_ = auVar121._8_4_ * fVar186;
      fVar187 = auVar219._12_4_;
      auVar125._12_4_ = auVar121._12_4_ * fVar187;
      fVar188 = auVar219._16_4_;
      auVar125._16_4_ = auVar121._16_4_ * fVar188;
      fVar189 = auVar219._20_4_;
      auVar125._20_4_ = auVar121._20_4_ * fVar189;
      fVar190 = auVar219._24_4_;
      auVar125._24_4_ = auVar121._24_4_ * fVar190;
      auVar125._28_4_ = 0;
      auVar23 = vfmsub231ps_fma(auVar125,auVar220,auVar158);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
      auVar126._0_4_ = auVar201._0_4_ * auVar184._0_4_;
      auVar126._4_4_ = auVar201._4_4_ * auVar184._4_4_;
      auVar126._8_4_ = auVar201._8_4_ * auVar184._8_4_;
      auVar126._12_4_ = auVar201._12_4_ * auVar184._12_4_;
      auVar126._16_4_ = auVar201._16_4_ * auVar184._16_4_;
      auVar126._20_4_ = auVar201._20_4_ * auVar184._20_4_;
      auVar126._24_4_ = auVar201._24_4_ * auVar184._24_4_;
      auVar126._28_4_ = 0;
      auVar177 = vfmsub231ps_fma(auVar126,auVar178,auVar139);
      auVar51._4_4_ = auVar200._4_4_ * auVar139._4_4_;
      auVar51._0_4_ = auVar200._0_4_ * auVar139._0_4_;
      auVar51._8_4_ = auVar200._8_4_ * auVar139._8_4_;
      auVar51._12_4_ = auVar200._12_4_ * auVar139._12_4_;
      auVar51._16_4_ = auVar200._16_4_ * auVar139._16_4_;
      auVar51._20_4_ = auVar200._20_4_ * auVar139._20_4_;
      auVar51._24_4_ = auVar200._24_4_ * auVar139._24_4_;
      auVar51._28_4_ = auVar139._28_4_;
      auVar157 = vfmsub231ps_fma(auVar51,auVar130,auVar201);
      auVar52._4_4_ = auVar178._4_4_ * auVar130._4_4_;
      auVar52._0_4_ = auVar178._0_4_ * auVar130._0_4_;
      auVar52._8_4_ = auVar178._8_4_ * auVar130._8_4_;
      auVar52._12_4_ = auVar178._12_4_ * auVar130._12_4_;
      auVar52._16_4_ = auVar178._16_4_ * auVar130._16_4_;
      auVar52._20_4_ = auVar178._20_4_ * auVar130._20_4_;
      auVar52._24_4_ = auVar178._24_4_ * auVar130._24_4_;
      auVar52._28_4_ = auVar25._28_4_;
      auVar163 = vfmsub231ps_fma(auVar52,auVar200,auVar184);
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar163),ZEXT832(0) << 0x20,ZEXT1632(auVar177));
      auVar157 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT832(0) << 0x20,ZEXT1632(auVar157));
      auVar184 = vmaxps_avx(ZEXT1632(auVar23),ZEXT1632(auVar157));
      auVar184 = vcmpps_avx(auVar184,ZEXT832(0) << 0x20,2);
      auVar177 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
      auVar114 = vpand_avx(auVar177,auVar114);
      auVar184 = vpmovsxwd_avx2(auVar114);
      if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar184 >> 0x7f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar184 >> 0xbf,0) == '\0') &&
          (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar184[0x1f]) {
LAB_01353d56:
        auVar170 = ZEXT3264(CONCAT824(uStack_688,
                                      CONCAT816(uStack_690,CONCAT88(uStack_698,local_6a0))));
        auVar119 = vpcmpeqd_avx2(auVar219,auVar219);
        auVar211 = ZEXT3264(auVar119);
      }
      else {
        auVar53._4_4_ = auVar121._4_4_ * auVar201._4_4_;
        auVar53._0_4_ = auVar121._0_4_ * auVar201._0_4_;
        auVar53._8_4_ = auVar121._8_4_ * auVar201._8_4_;
        auVar53._12_4_ = auVar121._12_4_ * auVar201._12_4_;
        auVar53._16_4_ = auVar121._16_4_ * auVar201._16_4_;
        auVar53._20_4_ = auVar121._20_4_ * auVar201._20_4_;
        auVar53._24_4_ = auVar121._24_4_ * auVar201._24_4_;
        auVar53._28_4_ = auVar184._28_4_;
        auVar192 = vfmsub231ps_fma(auVar53,auVar200,auVar158);
        auVar137._0_4_ = auVar158._0_4_ * auVar178._0_4_;
        auVar137._4_4_ = auVar158._4_4_ * auVar178._4_4_;
        auVar137._8_4_ = auVar158._8_4_ * auVar178._8_4_;
        auVar137._12_4_ = auVar158._12_4_ * auVar178._12_4_;
        auVar137._16_4_ = auVar158._16_4_ * auVar178._16_4_;
        auVar137._20_4_ = auVar158._20_4_ * auVar178._20_4_;
        auVar137._24_4_ = auVar158._24_4_ * auVar178._24_4_;
        auVar137._28_4_ = 0;
        auVar191 = vfmsub231ps_fma(auVar137,auVar24,auVar201);
        auVar54._4_4_ = auVar200._4_4_ * auVar24._4_4_;
        auVar54._0_4_ = auVar200._0_4_ * auVar24._0_4_;
        auVar54._8_4_ = auVar200._8_4_ * auVar24._8_4_;
        auVar54._12_4_ = auVar200._12_4_ * auVar24._12_4_;
        auVar54._16_4_ = auVar200._16_4_ * auVar24._16_4_;
        auVar54._20_4_ = auVar200._20_4_ * auVar24._20_4_;
        auVar54._24_4_ = auVar200._24_4_ * auVar24._24_4_;
        auVar54._28_4_ = auVar130._28_4_;
        auVar198 = vfmsub231ps_fma(auVar54,auVar178,auVar121);
        auVar177 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar191),ZEXT1632(auVar198));
        auVar163 = vfmadd231ps_fma(ZEXT1632(auVar177),ZEXT1632(auVar192),_DAT_01f7b000);
        auVar184 = vrcpps_avx(ZEXT1632(auVar163));
        auVar219._8_4_ = 0x3f800000;
        auVar219._0_8_ = 0x3f8000003f800000;
        auVar219._12_4_ = 0x3f800000;
        auVar219._16_4_ = 0x3f800000;
        auVar219._20_4_ = 0x3f800000;
        auVar219._24_4_ = 0x3f800000;
        auVar219._28_4_ = 0x3f800000;
        auVar177 = vfnmadd213ps_fma(auVar184,ZEXT1632(auVar163),auVar219);
        auVar177 = vfmadd132ps_fma(ZEXT1632(auVar177),auVar184,auVar184);
        auVar196._0_4_ = auVar198._0_4_ * fVar150;
        auVar196._4_4_ = auVar198._4_4_ * fVar185;
        auVar196._8_4_ = auVar198._8_4_ * fVar186;
        auVar196._12_4_ = auVar198._12_4_ * fVar187;
        auVar196._16_4_ = fVar188 * 0.0;
        auVar196._20_4_ = fVar189 * 0.0;
        auVar196._24_4_ = fVar190 * 0.0;
        auVar196._28_4_ = 0;
        auVar191 = vfmadd231ps_fma(auVar196,auVar220,ZEXT1632(auVar191));
        auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),ZEXT1632(auVar192),auVar119);
        fVar150 = auVar177._0_4_;
        fVar185 = auVar177._4_4_;
        fVar186 = auVar177._8_4_;
        fVar187 = auVar177._12_4_;
        auVar184 = ZEXT1632(CONCAT412(fVar187 * auVar191._12_4_,
                                      CONCAT48(fVar186 * auVar191._8_4_,
                                               CONCAT44(fVar185 * auVar191._4_4_,
                                                        fVar150 * auVar191._0_4_))));
        auVar127._4_4_ = uVar7;
        auVar127._0_4_ = uVar7;
        auVar127._8_4_ = uVar7;
        auVar127._12_4_ = uVar7;
        auVar127._16_4_ = uVar7;
        auVar127._20_4_ = uVar7;
        auVar127._24_4_ = uVar7;
        auVar127._28_4_ = uVar7;
        uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar138._4_4_ = uVar110;
        auVar138._0_4_ = uVar110;
        auVar138._8_4_ = uVar110;
        auVar138._12_4_ = uVar110;
        auVar138._16_4_ = uVar110;
        auVar138._20_4_ = uVar110;
        auVar138._24_4_ = uVar110;
        auVar138._28_4_ = uVar110;
        auVar119 = vcmpps_avx(auVar127,auVar184,2);
        auVar220 = vcmpps_avx(auVar184,auVar138,2);
        auVar119 = vandps_avx(auVar220,auVar119);
        auVar177 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
        auVar114 = vpand_avx(auVar114,auVar177);
        auVar119 = vpmovsxwd_avx2(auVar114);
        auVar149 = ZEXT864(0) << 0x20;
        if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar119 >> 0x7f,0) == '\0') &&
              (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar119 >> 0xbf,0) == '\0') &&
            (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar119[0x1f]) goto LAB_01353d56;
        auVar119 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar163),4);
        auVar177 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
        auVar114 = vpand_avx(auVar114,auVar177);
        auVar220 = vpmovsxwd_avx2(auVar114);
        auVar170 = ZEXT3264(CONCAT824(uStack_688,
                                      CONCAT816(uStack_690,CONCAT88(uStack_698,local_6a0))));
        auVar119 = vpcmpeqd_avx2(auVar219,auVar219);
        auVar211 = ZEXT3264(auVar119);
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar220 >> 0x7f,0) != '\0') ||
              (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar220 >> 0xbf,0) != '\0') ||
            (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar220[0x1f] < '\0') {
          auVar130 = ZEXT1632(CONCAT412(fVar187 * auVar23._12_4_,
                                        CONCAT48(fVar186 * auVar23._8_4_,
                                                 CONCAT44(fVar185 * auVar23._4_4_,
                                                          fVar150 * auVar23._0_4_))));
          auVar139 = ZEXT1632(CONCAT412(fVar187 * auVar157._12_4_,
                                        CONCAT48(fVar186 * auVar157._8_4_,
                                                 CONCAT44(fVar185 * auVar157._4_4_,
                                                          fVar150 * auVar157._0_4_))));
          auVar175._8_4_ = 0x3f800000;
          auVar175._0_8_ = 0x3f8000003f800000;
          auVar175._12_4_ = 0x3f800000;
          auVar175._16_4_ = 0x3f800000;
          auVar175._20_4_ = 0x3f800000;
          auVar175._24_4_ = 0x3f800000;
          auVar175._28_4_ = 0x3f800000;
          auVar119 = vsubps_avx(auVar175,auVar130);
          _local_2a0 = vblendvps_avx(auVar119,auVar130,auVar27);
          auVar119 = vsubps_avx(auVar175,auVar139);
          local_480 = vblendvps_avx(auVar119,auVar139,auVar27);
          auVar170 = ZEXT3264(auVar220);
          local_5e0 = auVar184;
        }
      }
      auVar221 = ZEXT3264(auVar247);
      auVar237 = ZEXT3264(auVar195);
      auVar231 = ZEXT3264(_local_780);
      auVar119 = auVar170._0_32_;
      if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar119 >> 0x7f,0) == '\0') &&
            (auVar170 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar119 >> 0xbf,0) == '\0') &&
          (auVar170 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar170[0x1f]) {
        auVar149 = ZEXT3264(local_7c0);
        auVar170 = ZEXT3264(local_720);
      }
      else {
        auVar220 = vsubps_avx(local_580,auVar195);
        auVar114 = vfmadd213ps_fma(auVar220,_local_2a0,auVar195);
        fVar150 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar55._4_4_ = (auVar114._4_4_ + auVar114._4_4_) * fVar150;
        auVar55._0_4_ = (auVar114._0_4_ + auVar114._0_4_) * fVar150;
        auVar55._8_4_ = (auVar114._8_4_ + auVar114._8_4_) * fVar150;
        auVar55._12_4_ = (auVar114._12_4_ + auVar114._12_4_) * fVar150;
        auVar55._16_4_ = fVar150 * 0.0;
        auVar55._20_4_ = fVar150 * 0.0;
        auVar55._24_4_ = fVar150 * 0.0;
        auVar55._28_4_ = 0;
        auVar220 = vcmpps_avx(local_5e0,auVar55,6);
        auVar184 = auVar119 & auVar220;
        auVar170 = ZEXT3264(auVar203);
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0x7f,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar184 >> 0xbf,0) != '\0') ||
            (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar184[0x1f] < '\0') {
          auVar140._8_4_ = 0xbf800000;
          auVar140._0_8_ = 0xbf800000bf800000;
          auVar140._12_4_ = 0xbf800000;
          auVar140._16_4_ = 0xbf800000;
          auVar140._20_4_ = 0xbf800000;
          auVar140._24_4_ = 0xbf800000;
          auVar140._28_4_ = 0xbf800000;
          auVar160._8_4_ = 0x40000000;
          auVar160._0_8_ = 0x4000000040000000;
          auVar160._12_4_ = 0x40000000;
          auVar160._16_4_ = 0x40000000;
          auVar160._20_4_ = 0x40000000;
          auVar160._24_4_ = 0x40000000;
          auVar160._28_4_ = 0x40000000;
          auVar114 = vfmadd213ps_fma(local_480,auVar160,auVar140);
          local_420 = _local_2a0;
          local_400 = ZEXT1632(auVar114);
          local_3e0 = local_5e0;
          local_3c0 = 0;
          local_480 = local_400;
          if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_700 = vandps_avx(auVar220,auVar119);
            fVar150 = 1.0 / (float)local_520._0_4_;
            local_340[0] = fVar150 * ((float)local_2a0._0_4_ + 0.0);
            local_340[1] = fVar150 * ((float)local_2a0._4_4_ + 1.0);
            local_340[2] = fVar150 * (fStack_298 + 2.0);
            local_340[3] = fVar150 * (fStack_294 + 3.0);
            fStack_330 = fVar150 * (fStack_290 + 4.0);
            fStack_32c = fVar150 * (fStack_28c + 5.0);
            fStack_328 = fVar150 * (fStack_288 + 6.0);
            fStack_324 = fStack_284 + 7.0;
            local_480._0_8_ = auVar114._0_8_;
            local_480._8_8_ = auVar114._8_8_;
            local_320 = local_480._0_8_;
            uStack_318 = local_480._8_8_;
            uStack_310 = 0;
            uStack_308 = 0;
            local_300 = local_5e0;
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar119 = vblendvps_avx(auVar141,local_5e0,local_700);
            auVar220 = vshufps_avx(auVar119,auVar119,0xb1);
            auVar220 = vminps_avx(auVar119,auVar220);
            auVar184 = vshufpd_avx(auVar220,auVar220,5);
            auVar220 = vminps_avx(auVar220,auVar184);
            auVar184 = vpermpd_avx2(auVar220,0x4e);
            auVar220 = vminps_avx(auVar220,auVar184);
            auVar220 = vcmpps_avx(auVar119,auVar220,0);
            auVar184 = local_700 & auVar220;
            auVar119 = local_700;
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0x7f,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0xbf,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar184[0x1f] < '\0') {
              auVar119 = vandps_avx(auVar220,local_700);
            }
            uVar106 = vmovmskps_avx(auVar119);
            uVar7 = 0;
            for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
              uVar7 = uVar7 + 1;
            }
            uVar107 = (ulong)uVar7;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar150 = local_340[uVar107];
              fVar185 = 1.0 - fVar150;
              auVar116 = ZEXT416((uint)fVar150);
              auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar116,ZEXT416(0xc0a00000))
              ;
              auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                        ZEXT416((uint)(fVar150 + fVar150)),auVar21);
              auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar116,ZEXT416(0x40000000))
              ;
              auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar185 * -3.0)),
                                        ZEXT416((uint)(fVar185 + fVar185)),auVar21);
              auVar114 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar185 + fVar185))),
                                          ZEXT416((uint)fVar185),ZEXT416((uint)fVar185));
              auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),auVar116,
                                         ZEXT416((uint)(fVar185 * -2.0)));
              fVar185 = auVar21._0_4_ * 0.5;
              fVar186 = auVar116._0_4_ * 0.5;
              auVar164._0_4_ = fVar186 * local_920;
              auVar164._4_4_ = fVar186 * fStack_91c;
              auVar164._8_4_ = fVar186 * fStack_918;
              auVar164._12_4_ = fVar186 * fStack_914;
              auVar133._4_4_ = fVar185;
              auVar133._0_4_ = fVar185;
              auVar133._8_4_ = fVar185;
              auVar133._12_4_ = fVar185;
              auVar21 = vfmadd132ps_fma(auVar133,auVar164,*pauVar3);
              fVar185 = auVar22._0_4_ * 0.5;
              auVar165._4_4_ = fVar185;
              auVar165._0_4_ = fVar185;
              auVar165._8_4_ = fVar185;
              auVar165._12_4_ = fVar185;
              auVar21 = vfmadd132ps_fma(auVar165,auVar21,*pauVar2);
              uVar110 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
              fVar185 = auVar114._0_4_ * 0.5;
              auVar152._4_4_ = fVar185;
              auVar152._0_4_ = fVar185;
              auVar152._8_4_ = fVar185;
              auVar152._12_4_ = fVar185;
              auVar21 = vfmadd132ps_fma(auVar152,auVar21,*pauVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar21._0_4_;
              uVar225 = vextractps_avx(auVar21,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar225;
              uVar225 = vextractps_avx(auVar21,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar225;
              *(float *)(ray + k * 4 + 0x1e0) = fVar150;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar110;
              *(uint *)(ray + k * 4 + 0x220) = uVar18;
              *(uint *)(ray + k * 4 + 0x240) = uVar105;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_8e0 = CONCAT44(uVar105,uVar105);
              uStack_8d8._0_4_ = uVar105;
              uStack_8d8._4_4_ = uVar105;
              uStack_8d0._0_4_ = uVar105;
              uStack_8d0._4_4_ = uVar105;
              auVar103 = _local_8e0;
              uStack_8c8._0_4_ = uVar105;
              uStack_8c8._4_4_ = uVar105;
              auVar119 = _local_8e0;
              local_740._4_4_ = uVar18;
              local_740._0_4_ = uVar18;
              local_740._8_4_ = uVar18;
              local_740._12_4_ = uVar18;
              local_740._16_4_ = uVar18;
              local_740._20_4_ = uVar18;
              local_740._24_4_ = uVar18;
              local_740._28_4_ = uVar18;
              auVar237 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              local_800 = auVar203;
              local_7d8 = context;
              local_7d0 = k;
              local_7a0 = auVar247;
              _local_5c0 = auVar129;
              local_3bc = iVar104;
              local_3b0 = uVar176;
              uStack_3a8 = uVar89;
              local_3a0 = uVar90;
              uStack_398 = uVar91;
              local_390 = uVar92;
              uStack_388 = uVar93;
              local_380 = uVar94;
              uStack_378 = uVar95;
              while( true ) {
                fVar150 = local_340[uVar107];
                auVar118._4_4_ = fVar150;
                auVar118._0_4_ = fVar150;
                auVar118._8_4_ = fVar150;
                auVar118._12_4_ = fVar150;
                local_220._16_4_ = fVar150;
                local_220._0_16_ = auVar118;
                local_220._20_4_ = fVar150;
                local_220._24_4_ = fVar150;
                local_220._28_4_ = fVar150;
                local_200 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
                fVar185 = 1.0 - fVar150;
                auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar118,
                                           ZEXT416(0xc0a00000));
                auVar177 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * 3.0)),
                                           ZEXT416((uint)(fVar150 + fVar150)),auVar114);
                auVar114 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar118,
                                           ZEXT416(0x40000000));
                auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar185 * -3.0)),
                                           ZEXT416((uint)(fVar185 + fVar185)),auVar114);
                auVar157 = vfnmadd231ss_fma(ZEXT416((uint)(fVar150 * (fVar185 + fVar185))),
                                            ZEXT416((uint)fVar185),ZEXT416((uint)fVar185));
                auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150)),auVar118,
                                          ZEXT416((uint)(fVar185 * -2.0)));
                fVar150 = auVar114._0_4_ * 0.5;
                fVar185 = auVar23._0_4_ * 0.5;
                auVar173._0_4_ = fVar185 * local_920;
                auVar173._4_4_ = fVar185 * fStack_91c;
                auVar173._8_4_ = fVar185 * fStack_918;
                auVar173._12_4_ = fVar185 * fStack_914;
                auVar156._4_4_ = fVar150;
                auVar156._0_4_ = fVar150;
                auVar156._8_4_ = fVar150;
                auVar156._12_4_ = fVar150;
                auVar114 = vfmadd132ps_fma(auVar156,auVar173,auVar21);
                fVar150 = auVar177._0_4_ * 0.5;
                auVar174._4_4_ = fVar150;
                auVar174._0_4_ = fVar150;
                auVar174._8_4_ = fVar150;
                auVar174._12_4_ = fVar150;
                auVar114 = vfmadd132ps_fma(auVar174,auVar114,auVar22);
                local_830.context = context->user;
                fVar150 = auVar157._0_4_ * 0.5;
                auVar157._4_4_ = fVar150;
                auVar157._0_4_ = fVar150;
                auVar157._8_4_ = fVar150;
                auVar157._12_4_ = fVar150;
                auVar177 = vfmadd132ps_fma(auVar157,auVar114,auVar116);
                local_280 = auVar177._0_4_;
                uStack_27c = local_280;
                uStack_278 = local_280;
                uStack_274 = local_280;
                uStack_270 = local_280;
                uStack_26c = local_280;
                uStack_268 = local_280;
                uStack_264 = local_280;
                auVar114 = vmovshdup_avx(auVar177);
                local_260 = auVar114._0_8_;
                uStack_258 = local_260;
                uStack_250 = local_260;
                uStack_248 = local_260;
                auVar114 = vshufps_avx(auVar177,auVar177,0xaa);
                local_240 = auVar114._0_8_;
                uStack_238 = local_240;
                uStack_230 = local_240;
                uStack_228 = local_240;
                uStack_1fc = local_200;
                uStack_1f8 = local_200;
                uStack_1f4 = local_200;
                uStack_1f0 = local_200;
                uStack_1ec = local_200;
                uStack_1e8 = local_200;
                uStack_1e4 = local_200;
                local_1e0 = local_740._0_8_;
                uStack_1d8 = local_740._8_8_;
                uStack_1d0 = local_740._16_8_;
                uStack_1c8 = local_740._24_8_;
                uStack_8d0 = auVar103._16_8_;
                uStack_8c8 = auVar119._24_8_;
                local_1c0 = local_8e0;
                uStack_1b8 = uStack_8d8;
                uStack_1b0 = uStack_8d0;
                uStack_1a8 = uStack_8c8;
                local_7c8[1] = auVar211._0_32_;
                *local_7c8 = auVar211._0_32_;
                local_1a0 = (local_830.context)->instID[0];
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = (local_830.context)->instPrimID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_6e0 = local_2e0;
                local_830.valid = (int *)local_6e0;
                local_830.geometryUserPtr = pGVar19->userPtr;
                local_830.hit = (RTCHitN *)&local_280;
                local_830.N = 8;
                local_830.ray = (RTCRayN *)ray;
                if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar220 = ZEXT1632(auVar211._0_16_);
                  (*pGVar19->intersectionFilterN)(&local_830);
                  auVar237 = ZEXT1664(auVar237._0_16_);
                  auVar231 = ZEXT3264(_local_780);
                  auVar221 = ZEXT3264(local_7a0);
                  auVar170 = ZEXT3264(local_800);
                  auVar220 = vpcmpeqd_avx2(auVar220,auVar220);
                  auVar211 = ZEXT3264(auVar220);
                  auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
                  context = local_7d8;
                  k = local_7d0;
                }
                auVar184 = vpcmpeqd_avx2(auVar149._0_32_,local_6e0);
                auVar220 = auVar211._0_32_ & ~auVar184;
                if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar220 >> 0x7f,0) == '\0') &&
                      (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar220 >> 0xbf,0) == '\0') &&
                    (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar220[0x1f]) {
                  auVar184 = auVar211._0_32_ ^ auVar184;
                }
                else {
                  p_Var20 = context->args->filter;
                  if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar220 = ZEXT1632(auVar211._0_16_);
                    (*p_Var20)(&local_830);
                    auVar237 = ZEXT1664(auVar237._0_16_);
                    auVar231 = ZEXT3264(_local_780);
                    auVar221 = ZEXT3264(local_7a0);
                    auVar170 = ZEXT3264(local_800);
                    auVar220 = vpcmpeqd_avx2(auVar220,auVar220);
                    auVar211 = ZEXT3264(auVar220);
                    auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
                    context = local_7d8;
                    k = local_7d0;
                  }
                  auVar130 = vpcmpeqd_avx2(auVar149._0_32_,local_6e0);
                  auVar184 = auVar211._0_32_ ^ auVar130;
                  auVar220 = auVar211._0_32_ & ~auVar130;
                  if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar220 >> 0x7f,0) != '\0') ||
                        (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar220 >> 0xbf,0) != '\0') ||
                      (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar220[0x1f] < '\0') {
                    auVar147._0_4_ = auVar211._0_4_ ^ auVar130._0_4_;
                    auVar147._4_4_ = auVar211._4_4_ ^ auVar130._4_4_;
                    auVar147._8_4_ = auVar211._8_4_ ^ auVar130._8_4_;
                    auVar147._12_4_ = auVar211._12_4_ ^ auVar130._12_4_;
                    auVar147._16_4_ = auVar211._16_4_ ^ auVar130._16_4_;
                    auVar147._20_4_ = auVar211._20_4_ ^ auVar130._20_4_;
                    auVar147._24_4_ = auVar211._24_4_ ^ auVar130._24_4_;
                    auVar147._28_4_ = auVar211._28_4_ ^ auVar130._28_4_;
                    auVar220 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])local_830.hit);
                    *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])(local_830.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])(local_830.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])(local_830.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar220;
                    auVar220 = vmaskmovps_avx(auVar147,*(undefined1 (*) [32])(local_830.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])(local_830.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])(local_830.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])(local_830.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar220;
                    auVar220 = vpmaskmovd_avx2(auVar147,*(undefined1 (*) [32])
                                                         (local_830.hit + 0x100));
                    *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar220;
                  }
                }
                auVar220 = local_5e0;
                auVar247 = auVar221._0_32_;
                auVar203 = auVar170._0_32_;
                if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar184 >> 0x7f,0) == '\0') &&
                      (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar184 >> 0xbf,0) == '\0') &&
                    (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar184[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar237._0_4_;
                }
                else {
                  auVar237 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_700 + uVar107 * 4) = 0;
                uVar110 = auVar237._0_4_;
                auVar132._4_4_ = uVar110;
                auVar132._0_4_ = uVar110;
                auVar132._8_4_ = uVar110;
                auVar132._12_4_ = uVar110;
                auVar132._16_4_ = uVar110;
                auVar132._20_4_ = uVar110;
                auVar132._24_4_ = uVar110;
                auVar132._28_4_ = uVar110;
                auVar130 = vcmpps_avx(auVar220,auVar132,2);
                auVar184 = vandps_avx(auVar130,local_700);
                local_700 = local_700 & auVar130;
                if ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_700 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_700 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_700 >> 0x7f,0) == '\0') &&
                      (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_700 >> 0xbf,0) == '\0') &&
                    (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_700[0x1f]) break;
                auVar148._8_4_ = 0x7f800000;
                auVar148._0_8_ = 0x7f8000007f800000;
                auVar148._12_4_ = 0x7f800000;
                auVar148._16_4_ = 0x7f800000;
                auVar148._20_4_ = 0x7f800000;
                auVar148._24_4_ = 0x7f800000;
                auVar148._28_4_ = 0x7f800000;
                auVar220 = vblendvps_avx(auVar148,auVar220,auVar184);
                auVar130 = vshufps_avx(auVar220,auVar220,0xb1);
                auVar130 = vminps_avx(auVar220,auVar130);
                auVar139 = vshufpd_avx(auVar130,auVar130,5);
                auVar130 = vminps_avx(auVar130,auVar139);
                auVar139 = vpermpd_avx2(auVar130,0x4e);
                auVar130 = vminps_avx(auVar130,auVar139);
                auVar130 = vcmpps_avx(auVar220,auVar130,0);
                auVar139 = auVar184 & auVar130;
                auVar220 = auVar184;
                if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar139 >> 0x7f,0) != '\0') ||
                      (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar139 >> 0xbf,0) != '\0') ||
                    (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar139[0x1f] < '\0') {
                  auVar220 = vandps_avx(auVar130,auVar184);
                }
                uVar106 = vmovmskps_avx(auVar220);
                uVar7 = 0;
                for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                  uVar7 = uVar7 + 1;
                }
                uVar107 = (ulong)uVar7;
                local_700 = auVar184;
              }
            }
          }
        }
        auVar149 = ZEXT3264(local_7c0);
        auVar170 = ZEXT3264(local_720);
      }
    }
    auVar221 = ZEXT3264(local_640);
    auVar211 = ZEXT3264(CONCAT428(fStack_4a4,
                                  CONCAT424(fStack_4a8,
                                            CONCAT420(fStack_4ac,
                                                      CONCAT416(fStack_4b0,
                                                                CONCAT412(fStack_4b4,
                                                                          CONCAT48(fStack_4b8,
                                                                                   CONCAT44(
                                                  fStack_4bc,local_4c0))))))));
    if (8 < iVar104) {
      local_440._4_4_ = iVar104;
      local_440._0_4_ = iVar104;
      local_440._8_4_ = iVar104;
      local_440._12_4_ = iVar104;
      local_440._16_4_ = iVar104;
      local_440._20_4_ = iVar104;
      local_440._24_4_ = iVar104;
      local_440._28_4_ = iVar104;
      local_460._4_4_ = fVar151;
      local_460._0_4_ = fVar151;
      fStack_458 = fVar151;
      fStack_454 = fVar151;
      fStack_450 = fVar151;
      fStack_44c = fVar151;
      fStack_448 = fVar151;
      fStack_444 = fVar151;
      local_120 = local_680._0_4_;
      uStack_11c = local_680._0_4_;
      uStack_118 = local_680._0_4_;
      uStack_114 = local_680._0_4_;
      uStack_110 = local_680._0_4_;
      uStack_10c = local_680._0_4_;
      uStack_108 = local_680._0_4_;
      uStack_104 = local_680._0_4_;
      local_160 = 1.0 / (float)local_520._0_4_;
      fStack_15c = local_160;
      fStack_158 = local_160;
      fStack_154 = local_160;
      fStack_150 = local_160;
      fStack_14c = local_160;
      fStack_148 = local_160;
      fStack_144 = local_160;
      local_140 = local_540._0_4_;
      uStack_13c = local_540._0_4_;
      uStack_138 = local_540._0_4_;
      uStack_134 = local_540._0_4_;
      uStack_130 = local_540._0_4_;
      uStack_12c = local_540._0_4_;
      uStack_128 = local_540._0_4_;
      uStack_124 = local_540._0_4_;
      local_560._4_4_ = local_560._0_4_;
      local_560._8_4_ = local_560._0_4_;
      local_560._12_4_ = local_560._0_4_;
      uStack_550 = local_560._0_4_;
      uStack_54c = local_560._0_4_;
      uStack_548 = local_560._0_4_;
      uStack_544 = local_560._0_4_;
      auVar10._8_8_ = uStack_618;
      auVar10._0_8_ = local_620;
      auVar10._16_8_ = uStack_610;
      auVar10._24_8_ = uStack_608;
      _local_780 = auVar231._0_32_;
      fVar151 = (float)local_760;
      fVar150 = local_760._4_4_;
      fVar185 = (float)uStack_758;
      fVar186 = uStack_758._4_4_;
      fVar187 = (float)uStack_750;
      fVar188 = uStack_750._4_4_;
      fVar189 = (float)uStack_748;
      uVar110 = uStack_748._4_4_;
      local_800 = auVar203;
      local_7a0 = auVar247;
      for (lVar112 = 8; local_7c0 = auVar149._0_32_, lVar112 < iVar104; lVar112 = lVar112 + 8) {
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar112 * 4 + lVar108);
        auVar220 = *(undefined1 (*) [32])(lVar108 + 0x22047f0 + lVar112 * 4);
        auVar184 = *(undefined1 (*) [32])(lVar108 + 0x2204c74 + lVar112 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar108 + 0x22050f8 + lVar112 * 4);
        fVar190 = *(float *)*pauVar5;
        fVar205 = *(float *)(*pauVar5 + 4);
        fVar206 = *(float *)(*pauVar5 + 8);
        fVar207 = *(float *)(*pauVar5 + 0xc);
        fVar222 = *(float *)(*pauVar5 + 0x10);
        fVar223 = *(float *)(*pauVar5 + 0x14);
        fVar224 = *(float *)(*pauVar5 + 0x18);
        auVar102 = *pauVar5;
        fVar208 = auVar211._0_4_;
        auVar232._0_4_ = fVar208 * fVar190;
        fVar212 = auVar211._4_4_;
        auVar232._4_4_ = fVar212 * fVar205;
        fVar213 = auVar211._8_4_;
        auVar232._8_4_ = fVar213 * fVar206;
        fVar214 = auVar211._12_4_;
        auVar232._12_4_ = fVar214 * fVar207;
        fVar215 = auVar211._16_4_;
        auVar232._16_4_ = fVar215 * fVar222;
        fVar216 = auVar211._20_4_;
        auVar232._20_4_ = fVar216 * fVar223;
        fVar217 = auVar211._24_4_;
        auVar232._28_36_ = auVar231._28_36_;
        auVar232._24_4_ = fVar217 * fVar224;
        auVar238._0_4_ = fVar190 * fVar151;
        auVar238._4_4_ = fVar205 * fVar150;
        auVar238._8_4_ = fVar206 * fVar185;
        auVar238._12_4_ = fVar207 * fVar186;
        auVar238._16_4_ = fVar222 * fVar187;
        auVar238._20_4_ = fVar223 * fVar188;
        auVar238._28_36_ = auVar237._28_36_;
        auVar238._24_4_ = fVar224 * fVar189;
        auVar21 = vfmadd231ps_fma(auVar232._0_32_,auVar184,auVar170._0_32_);
        auVar158 = auVar221._0_32_;
        auVar22 = vfmadd231ps_fma(auVar238._0_32_,auVar184,auVar158);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar220,auVar246);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar220,local_4e0);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar119,auVar240);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar119,auVar10);
        auVar130 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar112 * 4 + lVar108);
        auVar139 = *(undefined1 (*) [32])(lVar108 + 0x2206c10 + lVar112 * 4);
        auVar180 = *(undefined1 (*) [32])(lVar108 + 0x2207094 + lVar112 * 4);
        pfVar6 = (float *)(lVar108 + 0x2207518 + lVar112 * 4);
        fVar88 = *pfVar6;
        fVar234 = pfVar6[1];
        fVar239 = pfVar6[2];
        fVar227 = pfVar6[3];
        fVar233 = pfVar6[4];
        fVar242 = pfVar6[5];
        fVar243 = pfVar6[6];
        auVar56._4_4_ = fVar212 * fVar234;
        auVar56._0_4_ = fVar208 * fVar88;
        auVar56._8_4_ = fVar213 * fVar239;
        auVar56._12_4_ = fVar214 * fVar227;
        auVar56._16_4_ = fVar215 * fVar233;
        auVar56._20_4_ = fVar216 * fVar242;
        auVar56._24_4_ = fVar217 * fVar243;
        auVar56._28_4_ = auVar119._28_4_;
        auVar57._4_4_ = fVar150 * fVar234;
        auVar57._0_4_ = fVar151 * fVar88;
        auVar57._8_4_ = fVar185 * fVar239;
        auVar57._12_4_ = fVar186 * fVar227;
        auVar57._16_4_ = fVar187 * fVar233;
        auVar57._20_4_ = fVar188 * fVar242;
        auVar57._24_4_ = fVar189 * fVar243;
        auVar57._28_4_ = uVar110;
        auVar116 = vfmadd231ps_fma(auVar56,auVar180,auVar170._0_32_);
        auVar114 = vfmadd231ps_fma(auVar57,auVar180,auVar158);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar139,auVar246);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar139,local_4e0);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar130,auVar240);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar130,auVar10);
        local_680 = ZEXT1632(auVar116);
        local_580 = ZEXT1632(auVar21);
        auVar26 = vsubps_avx(local_680,local_580);
        auVar121 = ZEXT1632(auVar114);
        local_740 = ZEXT1632(auVar22);
        auVar27 = vsubps_avx(auVar121,local_740);
        auVar58._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar58._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar58._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar58._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar58._16_4_ = auVar26._16_4_ * 0.0;
        auVar58._20_4_ = auVar26._20_4_ * 0.0;
        auVar58._24_4_ = auVar26._24_4_ * 0.0;
        auVar58._28_4_ = auVar10._28_4_;
        fVar151 = auVar27._0_4_;
        auVar142._0_4_ = auVar21._0_4_ * fVar151;
        fVar150 = auVar27._4_4_;
        auVar142._4_4_ = auVar21._4_4_ * fVar150;
        fVar185 = auVar27._8_4_;
        auVar142._8_4_ = auVar21._8_4_ * fVar185;
        fVar186 = auVar27._12_4_;
        auVar142._12_4_ = auVar21._12_4_ * fVar186;
        fVar187 = auVar27._16_4_;
        auVar142._16_4_ = fVar187 * 0.0;
        fVar188 = auVar27._20_4_;
        auVar142._20_4_ = fVar188 * 0.0;
        fVar189 = auVar27._24_4_;
        auVar142._24_4_ = fVar189 * 0.0;
        auVar142._28_4_ = 0;
        auVar231 = ZEXT3264(auVar184);
        auVar129 = vsubps_avx(auVar58,auVar142);
        auVar59._4_4_ = local_100._4_4_ * fVar205;
        auVar59._0_4_ = (float)local_100 * fVar190;
        auVar59._8_4_ = (float)uStack_f8 * fVar206;
        auVar59._12_4_ = uStack_f8._4_4_ * fVar207;
        auVar59._16_4_ = (float)uStack_f0 * fVar222;
        auVar59._20_4_ = uStack_f0._4_4_ * fVar223;
        auVar59._24_4_ = (float)uStack_e8 * fVar224;
        auVar59._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar59,auVar184,local_e0);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_c0,auVar220);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,auVar119);
        auVar60._4_4_ = local_100._4_4_ * fVar234;
        auVar60._0_4_ = (float)local_100 * fVar88;
        auVar60._8_4_ = (float)uStack_f8 * fVar239;
        auVar60._12_4_ = uStack_f8._4_4_ * fVar227;
        auVar60._16_4_ = (float)uStack_f0 * fVar233;
        auVar60._20_4_ = uStack_f0._4_4_ * fVar242;
        auVar60._24_4_ = (float)uStack_e8 * fVar243;
        auVar60._28_4_ = uStack_e8._4_4_;
        auVar22 = vfmadd231ps_fma(auVar60,auVar180,local_e0);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar139,local_c0);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar130,local_a0);
        auVar237 = ZEXT1664(auVar22);
        auVar149._0_4_ = fVar151 * fVar151;
        auVar149._4_4_ = fVar150 * fVar150;
        auVar149._8_4_ = fVar185 * fVar185;
        auVar149._12_4_ = fVar186 * fVar186;
        auVar149._16_4_ = fVar187 * fVar187;
        auVar149._20_4_ = fVar188 * fVar188;
        auVar149._28_36_ = auVar211._28_36_;
        auVar149._24_4_ = fVar189 * fVar189;
        auVar116 = vfmadd231ps_fma(auVar149._0_32_,auVar26,auVar26);
        local_500 = ZEXT1632(auVar21);
        auVar178 = ZEXT1632(auVar22);
        auVar25 = vmaxps_avx(local_500,auVar178);
        auVar209._0_4_ = auVar25._0_4_ * auVar25._0_4_ * auVar116._0_4_;
        auVar209._4_4_ = auVar25._4_4_ * auVar25._4_4_ * auVar116._4_4_;
        auVar209._8_4_ = auVar25._8_4_ * auVar25._8_4_ * auVar116._8_4_;
        auVar209._12_4_ = auVar25._12_4_ * auVar25._12_4_ * auVar116._12_4_;
        auVar209._16_4_ = auVar25._16_4_ * auVar25._16_4_ * 0.0;
        auVar209._20_4_ = auVar25._20_4_ * auVar25._20_4_ * 0.0;
        auVar209._24_4_ = auVar25._24_4_ * auVar25._24_4_ * 0.0;
        auVar209._28_4_ = 0;
        auVar61._4_4_ = auVar129._4_4_ * auVar129._4_4_;
        auVar61._0_4_ = auVar129._0_4_ * auVar129._0_4_;
        auVar61._8_4_ = auVar129._8_4_ * auVar129._8_4_;
        auVar61._12_4_ = auVar129._12_4_ * auVar129._12_4_;
        auVar61._16_4_ = auVar129._16_4_ * auVar129._16_4_;
        auVar61._20_4_ = auVar129._20_4_ * auVar129._20_4_;
        auVar61._24_4_ = auVar129._24_4_ * auVar129._24_4_;
        auVar61._28_4_ = auVar129._28_4_;
        auVar25 = vcmpps_avx(auVar61,auVar209,2);
        local_3c0 = (int)lVar112;
        auVar210._4_4_ = local_3c0;
        auVar210._0_4_ = local_3c0;
        auVar210._8_4_ = local_3c0;
        auVar210._12_4_ = local_3c0;
        auVar210._16_4_ = local_3c0;
        auVar210._20_4_ = local_3c0;
        auVar210._24_4_ = local_3c0;
        auVar210._28_4_ = local_3c0;
        auVar129 = vpor_avx2(auVar210,_DAT_01fb4ba0);
        auVar24 = vpcmpgtd_avx2(local_440,auVar129);
        auVar129 = auVar24 & auVar25;
        fVar151 = (float)local_760;
        fVar150 = local_760._4_4_;
        fVar185 = (float)uStack_758;
        fVar186 = uStack_758._4_4_;
        fVar187 = (float)uStack_750;
        fVar188 = uStack_750._4_4_;
        fVar189 = (float)uStack_748;
        uVar110 = uStack_748._4_4_;
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar129 >> 0xbf,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar129[0x1f]) {
          auVar149 = ZEXT3264(local_7c0);
          auVar221 = ZEXT3264(auVar158);
          auVar211 = ZEXT3264(auVar211._0_32_);
        }
        else {
          _local_5c0 = vandps_avx(auVar24,auVar25);
          auVar62._4_4_ = (float)local_780._4_4_ * fVar234;
          auVar62._0_4_ = (float)local_780._0_4_ * fVar88;
          auVar62._8_4_ = fStack_778 * fVar239;
          auVar62._12_4_ = fStack_774 * fVar227;
          auVar62._16_4_ = fStack_770 * fVar233;
          auVar62._20_4_ = fStack_76c * fVar242;
          auVar62._24_4_ = fStack_768 * fVar243;
          auVar62._28_4_ = auVar25._28_4_;
          auVar21 = vfmadd213ps_fma(auVar180,local_7a0,auVar62);
          auVar21 = vfmadd213ps_fma(auVar139,local_800,ZEXT1632(auVar21));
          auVar21 = vfmadd132ps_fma(auVar130,ZEXT1632(auVar21),local_660);
          local_520 = ZEXT1632(auVar21);
          local_5a0._0_4_ = auVar102._0_4_;
          local_5a0._4_4_ = auVar102._4_4_;
          fStack_598 = auVar102._8_4_;
          fStack_594 = auVar102._12_4_;
          fStack_590 = auVar102._16_4_;
          fStack_58c = auVar102._20_4_;
          fStack_588 = auVar102._24_4_;
          auVar63._4_4_ = (float)local_780._4_4_ * (float)local_5a0._4_4_;
          auVar63._0_4_ = (float)local_780._0_4_ * (float)local_5a0._0_4_;
          auVar63._8_4_ = fStack_778 * fStack_598;
          auVar63._12_4_ = fStack_774 * fStack_594;
          auVar63._16_4_ = fStack_770 * fStack_590;
          auVar63._20_4_ = fStack_76c * fStack_58c;
          auVar63._24_4_ = fStack_768 * fStack_588;
          auVar63._28_4_ = auVar25._28_4_;
          auVar21 = vfmadd213ps_fma(auVar184,local_7a0,auVar63);
          auVar21 = vfmadd213ps_fma(auVar220,local_800,ZEXT1632(auVar21));
          auVar220 = *(undefined1 (*) [32])(lVar108 + 0x220557c + lVar112 * 4);
          auVar184 = *(undefined1 (*) [32])(lVar108 + 0x2205a00 + lVar112 * 4);
          auVar130 = *(undefined1 (*) [32])(lVar108 + 0x2205e84 + lVar112 * 4);
          pfVar6 = (float *)(lVar108 + 0x2206308 + lVar112 * 4);
          fVar190 = *pfVar6;
          fVar205 = pfVar6[1];
          fVar206 = pfVar6[2];
          fVar207 = pfVar6[3];
          fVar222 = pfVar6[4];
          fVar223 = pfVar6[5];
          fVar224 = pfVar6[6];
          auVar64._4_4_ = fVar212 * fVar205;
          auVar64._0_4_ = fVar208 * fVar190;
          auVar64._8_4_ = fVar213 * fVar206;
          auVar64._12_4_ = fVar214 * fVar207;
          auVar64._16_4_ = fVar215 * fVar222;
          auVar64._20_4_ = fVar216 * fVar223;
          auVar64._24_4_ = fVar217 * fVar224;
          auVar64._28_4_ = uStack_764;
          auVar229._0_4_ = fVar190 * (float)local_760;
          auVar229._4_4_ = fVar205 * local_760._4_4_;
          auVar229._8_4_ = fVar206 * (float)uStack_758;
          auVar229._12_4_ = fVar207 * uStack_758._4_4_;
          auVar229._16_4_ = fVar222 * (float)uStack_750;
          auVar229._20_4_ = fVar223 * uStack_750._4_4_;
          auVar229._24_4_ = fVar224 * (float)uStack_748;
          auVar229._28_4_ = 0;
          auVar65._4_4_ = fVar205 * (float)local_780._4_4_;
          auVar65._0_4_ = fVar190 * (float)local_780._0_4_;
          auVar65._8_4_ = fVar206 * fStack_778;
          auVar65._12_4_ = fVar207 * fStack_774;
          auVar65._16_4_ = fVar222 * fStack_770;
          auVar65._20_4_ = fVar223 * fStack_76c;
          auVar65._24_4_ = fVar224 * fStack_768;
          auVar65._28_4_ = pfVar6[7];
          auVar22 = vfmadd231ps_fma(auVar64,auVar130,local_720);
          auVar116 = vfmadd231ps_fma(auVar229,auVar130,auVar158);
          auVar114 = vfmadd231ps_fma(auVar65,local_7a0,auVar130);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar184,auVar246);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar184,local_4e0);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),local_800,auVar184);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar220,auVar240);
          auVar99._8_8_ = uStack_618;
          auVar99._0_8_ = local_620;
          auVar99._16_8_ = uStack_610;
          auVar99._24_8_ = uStack_608;
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar220,auVar99);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar220,local_660);
          pfVar6 = (float *)(lVar108 + 0x2208728 + lVar112 * 4);
          fVar190 = *pfVar6;
          fVar205 = pfVar6[1];
          fVar206 = pfVar6[2];
          fVar207 = pfVar6[3];
          fVar222 = pfVar6[4];
          fVar223 = pfVar6[5];
          fVar224 = pfVar6[6];
          auVar66._4_4_ = fVar212 * fVar205;
          auVar66._0_4_ = fVar208 * fVar190;
          auVar66._8_4_ = fVar213 * fVar206;
          auVar66._12_4_ = fVar214 * fVar207;
          auVar66._16_4_ = fVar215 * fVar222;
          auVar66._20_4_ = fVar216 * fVar223;
          auVar66._24_4_ = fVar217 * fVar224;
          auVar66._28_4_ = auVar26._28_4_;
          auVar67._4_4_ = local_760._4_4_ * fVar205;
          auVar67._0_4_ = (float)local_760 * fVar190;
          auVar67._8_4_ = (float)uStack_758 * fVar206;
          auVar67._12_4_ = uStack_758._4_4_ * fVar207;
          auVar67._16_4_ = (float)uStack_750 * fVar222;
          auVar67._20_4_ = uStack_750._4_4_ * fVar223;
          auVar67._24_4_ = (float)uStack_748 * fVar224;
          auVar67._28_4_ = auVar27._28_4_;
          auVar68._4_4_ = (float)local_780._4_4_ * fVar205;
          auVar68._0_4_ = (float)local_780._0_4_ * fVar190;
          auVar68._8_4_ = fStack_778 * fVar206;
          auVar68._12_4_ = fStack_774 * fVar207;
          auVar68._16_4_ = fStack_770 * fVar222;
          auVar68._20_4_ = fStack_76c * fVar223;
          auVar68._24_4_ = fStack_768 * fVar224;
          auVar68._28_4_ = pfVar6[7];
          auVar220 = *(undefined1 (*) [32])(lVar108 + 0x22082a4 + lVar112 * 4);
          auVar177 = vfmadd231ps_fma(auVar66,auVar220,local_720);
          auVar23 = vfmadd231ps_fma(auVar67,auVar220,auVar158);
          auVar157 = vfmadd231ps_fma(auVar68,auVar220,local_7a0);
          auVar220 = *(undefined1 (*) [32])(lVar108 + 0x2207e20 + lVar112 * 4);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar220,auVar246);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar220,local_4e0);
          auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar220,local_800);
          auVar220 = *(undefined1 (*) [32])(lVar108 + 0x220799c + lVar112 * 4);
          auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar220,auVar240);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar220,auVar99);
          auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),local_660,auVar220);
          auVar220 = vandps_avx(ZEXT1632(auVar22),local_2c0);
          auVar184 = vandps_avx(ZEXT1632(auVar116),local_2c0);
          auVar184 = vmaxps_avx(auVar220,auVar184);
          auVar220 = vandps_avx(ZEXT1632(auVar114),local_2c0);
          auVar220 = vmaxps_avx(auVar184,auVar220);
          auVar220 = vcmpps_avx(auVar220,_local_460,1);
          auVar130 = vblendvps_avx(ZEXT1632(auVar22),auVar26,auVar220);
          auVar139 = vblendvps_avx(ZEXT1632(auVar116),auVar27,auVar220);
          auVar220 = vandps_avx(ZEXT1632(auVar177),local_2c0);
          auVar184 = vandps_avx(ZEXT1632(auVar23),local_2c0);
          auVar184 = vmaxps_avx(auVar220,auVar184);
          auVar220 = vandps_avx(local_2c0,ZEXT1632(auVar157));
          auVar220 = vmaxps_avx(auVar184,auVar220);
          auVar184 = vcmpps_avx(auVar220,_local_460,1);
          auVar220 = vblendvps_avx(ZEXT1632(auVar177),auVar26,auVar184);
          auVar184 = vblendvps_avx(ZEXT1632(auVar23),auVar27,auVar184);
          auVar21 = vfmadd213ps_fma(auVar119,local_660,ZEXT1632(auVar21));
          auVar22 = vfmadd213ps_fma(auVar130,auVar130,ZEXT832(0) << 0x20);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar139,auVar139);
          auVar119 = vrsqrtps_avx(ZEXT1632(auVar22));
          fVar190 = auVar119._0_4_;
          fVar205 = auVar119._4_4_;
          fVar206 = auVar119._8_4_;
          fVar207 = auVar119._12_4_;
          fVar222 = auVar119._16_4_;
          fVar223 = auVar119._20_4_;
          fVar224 = auVar119._24_4_;
          auVar69._4_4_ = fVar205 * fVar205 * fVar205 * auVar22._4_4_ * -0.5;
          auVar69._0_4_ = fVar190 * fVar190 * fVar190 * auVar22._0_4_ * -0.5;
          auVar69._8_4_ = fVar206 * fVar206 * fVar206 * auVar22._8_4_ * -0.5;
          auVar69._12_4_ = fVar207 * fVar207 * fVar207 * auVar22._12_4_ * -0.5;
          auVar69._16_4_ = fVar222 * fVar222 * fVar222 * -0.0;
          auVar69._20_4_ = fVar223 * fVar223 * fVar223 * -0.0;
          auVar69._24_4_ = fVar224 * fVar224 * fVar224 * -0.0;
          auVar69._28_4_ = 0;
          auVar161._8_4_ = 0x3fc00000;
          auVar161._0_8_ = 0x3fc000003fc00000;
          auVar161._12_4_ = 0x3fc00000;
          auVar161._16_4_ = 0x3fc00000;
          auVar161._20_4_ = 0x3fc00000;
          auVar161._24_4_ = 0x3fc00000;
          auVar161._28_4_ = 0x3fc00000;
          auVar22 = vfmadd231ps_fma(auVar69,auVar161,auVar119);
          fVar190 = auVar22._0_4_;
          fVar205 = auVar22._4_4_;
          auVar70._4_4_ = auVar139._4_4_ * fVar205;
          auVar70._0_4_ = auVar139._0_4_ * fVar190;
          fVar206 = auVar22._8_4_;
          auVar70._8_4_ = auVar139._8_4_ * fVar206;
          fVar207 = auVar22._12_4_;
          auVar70._12_4_ = auVar139._12_4_ * fVar207;
          auVar70._16_4_ = auVar139._16_4_ * 0.0;
          auVar70._20_4_ = auVar139._20_4_ * 0.0;
          auVar70._24_4_ = auVar139._24_4_ * 0.0;
          auVar70._28_4_ = auVar139._28_4_;
          auVar71._4_4_ = fVar205 * -auVar130._4_4_;
          auVar71._0_4_ = fVar190 * -auVar130._0_4_;
          auVar71._8_4_ = fVar206 * -auVar130._8_4_;
          auVar71._12_4_ = fVar207 * -auVar130._12_4_;
          auVar71._16_4_ = -auVar130._16_4_ * 0.0;
          auVar71._20_4_ = -auVar130._20_4_ * 0.0;
          auVar71._24_4_ = -auVar130._24_4_ * 0.0;
          auVar71._28_4_ = auVar119._28_4_;
          auVar22 = vfmadd213ps_fma(auVar220,auVar220,ZEXT832(0) << 0x20);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar184,auVar184);
          auVar119 = vrsqrtps_avx(ZEXT1632(auVar22));
          auVar72._28_4_ = auVar27._28_4_;
          auVar72._0_28_ =
               ZEXT1628(CONCAT412(fVar207 * 0.0,
                                  CONCAT48(fVar206 * 0.0,CONCAT44(fVar205 * 0.0,fVar190 * 0.0))));
          fVar190 = auVar119._0_4_;
          fVar205 = auVar119._4_4_;
          fVar206 = auVar119._8_4_;
          fVar207 = auVar119._12_4_;
          fVar222 = auVar119._16_4_;
          fVar223 = auVar119._20_4_;
          fVar224 = auVar119._24_4_;
          auVar73._4_4_ = fVar205 * fVar205 * fVar205 * auVar22._4_4_ * -0.5;
          auVar73._0_4_ = fVar190 * fVar190 * fVar190 * auVar22._0_4_ * -0.5;
          auVar73._8_4_ = fVar206 * fVar206 * fVar206 * auVar22._8_4_ * -0.5;
          auVar73._12_4_ = fVar207 * fVar207 * fVar207 * auVar22._12_4_ * -0.5;
          auVar73._16_4_ = fVar222 * fVar222 * fVar222 * -0.0;
          auVar73._20_4_ = fVar223 * fVar223 * fVar223 * -0.0;
          auVar73._24_4_ = fVar224 * fVar224 * fVar224 * -0.0;
          auVar73._28_4_ = 0;
          auVar22 = vfmadd231ps_fma(auVar73,auVar161,auVar119);
          fVar190 = auVar22._0_4_;
          fVar205 = auVar22._4_4_;
          auVar74._4_4_ = auVar184._4_4_ * fVar205;
          auVar74._0_4_ = auVar184._0_4_ * fVar190;
          fVar206 = auVar22._8_4_;
          auVar74._8_4_ = auVar184._8_4_ * fVar206;
          fVar207 = auVar22._12_4_;
          auVar74._12_4_ = auVar184._12_4_ * fVar207;
          auVar74._16_4_ = auVar184._16_4_ * 0.0;
          auVar74._20_4_ = auVar184._20_4_ * 0.0;
          auVar74._24_4_ = auVar184._24_4_ * 0.0;
          auVar74._28_4_ = 0;
          auVar75._4_4_ = fVar205 * -auVar220._4_4_;
          auVar75._0_4_ = fVar190 * -auVar220._0_4_;
          auVar75._8_4_ = fVar206 * -auVar220._8_4_;
          auVar75._12_4_ = fVar207 * -auVar220._12_4_;
          auVar75._16_4_ = -auVar220._16_4_ * 0.0;
          auVar75._20_4_ = -auVar220._20_4_ * 0.0;
          auVar75._24_4_ = -auVar220._24_4_ * 0.0;
          auVar75._28_4_ = 0;
          auVar76._28_4_ = 0xbf000000;
          auVar76._0_28_ =
               ZEXT1628(CONCAT412(fVar207 * 0.0,
                                  CONCAT48(fVar206 * 0.0,CONCAT44(fVar205 * 0.0,fVar190 * 0.0))));
          auVar22 = vfmadd213ps_fma(auVar70,local_500,local_580);
          auVar116 = vfmadd213ps_fma(auVar71,local_500,local_740);
          auVar114 = vfmadd213ps_fma(auVar72,local_500,ZEXT1632(auVar21));
          auVar191 = vfnmadd213ps_fma(auVar70,local_500,local_580);
          auVar177 = vfmadd213ps_fma(auVar74,auVar178,local_680);
          auVar192 = vfnmadd213ps_fma(auVar71,local_500,local_740);
          auVar23 = vfmadd213ps_fma(auVar75,auVar178,auVar121);
          auVar21 = vfnmadd231ps_fma(ZEXT1632(auVar21),local_500,auVar72);
          auVar157 = vfmadd213ps_fma(auVar76,auVar178,local_520);
          auVar198 = vfnmadd213ps_fma(auVar74,auVar178,local_680);
          auVar199 = vfnmadd213ps_fma(auVar75,auVar178,auVar121);
          auVar28 = vfnmadd231ps_fma(local_520,auVar178,auVar76);
          auVar119 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar192));
          auVar220 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar21));
          auVar77._4_4_ = auVar119._4_4_ * auVar21._4_4_;
          auVar77._0_4_ = auVar119._0_4_ * auVar21._0_4_;
          auVar77._8_4_ = auVar119._8_4_ * auVar21._8_4_;
          auVar77._12_4_ = auVar119._12_4_ * auVar21._12_4_;
          auVar77._16_4_ = auVar119._16_4_ * 0.0;
          auVar77._20_4_ = auVar119._20_4_ * 0.0;
          auVar77._24_4_ = auVar119._24_4_ * 0.0;
          auVar77._28_4_ = 0;
          auVar163 = vfmsub231ps_fma(auVar77,ZEXT1632(auVar192),auVar220);
          auVar78._4_4_ = auVar191._4_4_ * auVar220._4_4_;
          auVar78._0_4_ = auVar191._0_4_ * auVar220._0_4_;
          auVar78._8_4_ = auVar191._8_4_ * auVar220._8_4_;
          auVar78._12_4_ = auVar191._12_4_ * auVar220._12_4_;
          auVar78._16_4_ = auVar220._16_4_ * 0.0;
          auVar78._20_4_ = auVar220._20_4_ * 0.0;
          auVar78._24_4_ = auVar220._24_4_ * 0.0;
          auVar78._28_4_ = auVar220._28_4_;
          auVar180 = ZEXT1632(auVar191);
          auVar220 = vsubps_avx(ZEXT1632(auVar177),auVar180);
          auVar129 = ZEXT1632(auVar21);
          auVar21 = vfmsub231ps_fma(auVar78,auVar129,auVar220);
          auVar79._4_4_ = auVar192._4_4_ * auVar220._4_4_;
          auVar79._0_4_ = auVar192._0_4_ * auVar220._0_4_;
          auVar79._8_4_ = auVar192._8_4_ * auVar220._8_4_;
          auVar79._12_4_ = auVar192._12_4_ * auVar220._12_4_;
          auVar79._16_4_ = auVar220._16_4_ * 0.0;
          auVar79._20_4_ = auVar220._20_4_ * 0.0;
          auVar79._24_4_ = auVar220._24_4_ * 0.0;
          auVar79._28_4_ = auVar220._28_4_;
          auVar191 = vfmsub231ps_fma(auVar79,auVar180,auVar119);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar191),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar163));
          auVar24 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
          auVar119 = vblendvps_avx(ZEXT1632(auVar198),ZEXT1632(auVar22),auVar24);
          auVar220 = vblendvps_avx(ZEXT1632(auVar199),ZEXT1632(auVar116),auVar24);
          local_680 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar114),auVar24);
          auVar184 = vblendvps_avx(auVar180,ZEXT1632(auVar177),auVar24);
          auVar130 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar23),auVar24);
          auVar139 = vblendvps_avx(auVar129,ZEXT1632(auVar157),auVar24);
          auVar180 = vblendvps_avx(ZEXT1632(auVar177),auVar180,auVar24);
          auVar25 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar192),auVar24);
          auVar21 = vpackssdw_avx(local_5c0._0_16_,local_5c0._16_16_);
          auVar129 = vblendvps_avx(ZEXT1632(auVar157),auVar129,auVar24);
          auVar180 = vsubps_avx(auVar180,auVar119);
          auVar25 = vsubps_avx(auVar25,auVar220);
          auVar121 = vsubps_avx(auVar129,local_680);
          auVar231 = ZEXT3264(auVar121);
          auVar158 = vsubps_avx(auVar119,auVar184);
          auVar200 = vsubps_avx(auVar220,auVar130);
          auVar201 = vsubps_avx(local_680,auVar139);
          auVar237 = ZEXT3264(auVar201);
          auVar181._0_4_ = auVar121._0_4_ * auVar119._0_4_;
          auVar181._4_4_ = auVar121._4_4_ * auVar119._4_4_;
          auVar181._8_4_ = auVar121._8_4_ * auVar119._8_4_;
          auVar181._12_4_ = auVar121._12_4_ * auVar119._12_4_;
          auVar181._16_4_ = auVar121._16_4_ * auVar119._16_4_;
          auVar181._20_4_ = auVar121._20_4_ * auVar119._20_4_;
          auVar181._24_4_ = auVar121._24_4_ * auVar119._24_4_;
          auVar181._28_4_ = 0;
          auVar22 = vfmsub231ps_fma(auVar181,local_680,auVar180);
          auVar80._4_4_ = auVar180._4_4_ * auVar220._4_4_;
          auVar80._0_4_ = auVar180._0_4_ * auVar220._0_4_;
          auVar80._8_4_ = auVar180._8_4_ * auVar220._8_4_;
          auVar80._12_4_ = auVar180._12_4_ * auVar220._12_4_;
          auVar80._16_4_ = auVar180._16_4_ * auVar220._16_4_;
          auVar80._20_4_ = auVar180._20_4_ * auVar220._20_4_;
          auVar80._24_4_ = auVar180._24_4_ * auVar220._24_4_;
          auVar80._28_4_ = auVar129._28_4_;
          auVar116 = vfmsub231ps_fma(auVar80,auVar119,auVar25);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
          auVar182._0_4_ = auVar25._0_4_ * local_680._0_4_;
          auVar182._4_4_ = auVar25._4_4_ * local_680._4_4_;
          auVar182._8_4_ = auVar25._8_4_ * local_680._8_4_;
          auVar182._12_4_ = auVar25._12_4_ * local_680._12_4_;
          auVar182._16_4_ = auVar25._16_4_ * local_680._16_4_;
          auVar182._20_4_ = auVar25._20_4_ * local_680._20_4_;
          auVar182._24_4_ = auVar25._24_4_ * local_680._24_4_;
          auVar182._28_4_ = 0;
          auVar116 = vfmsub231ps_fma(auVar182,auVar220,auVar121);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar116));
          auVar183._0_4_ = auVar201._0_4_ * auVar184._0_4_;
          auVar183._4_4_ = auVar201._4_4_ * auVar184._4_4_;
          auVar183._8_4_ = auVar201._8_4_ * auVar184._8_4_;
          auVar183._12_4_ = auVar201._12_4_ * auVar184._12_4_;
          auVar183._16_4_ = auVar201._16_4_ * auVar184._16_4_;
          auVar183._20_4_ = auVar201._20_4_ * auVar184._20_4_;
          auVar183._24_4_ = auVar201._24_4_ * auVar184._24_4_;
          auVar183._28_4_ = 0;
          auVar22 = vfmsub231ps_fma(auVar183,auVar158,auVar139);
          auVar81._4_4_ = auVar200._4_4_ * auVar139._4_4_;
          auVar81._0_4_ = auVar200._0_4_ * auVar139._0_4_;
          auVar81._8_4_ = auVar200._8_4_ * auVar139._8_4_;
          auVar81._12_4_ = auVar200._12_4_ * auVar139._12_4_;
          auVar81._16_4_ = auVar200._16_4_ * auVar139._16_4_;
          auVar81._20_4_ = auVar200._20_4_ * auVar139._20_4_;
          auVar81._24_4_ = auVar200._24_4_ * auVar139._24_4_;
          auVar81._28_4_ = auVar119._28_4_;
          auVar114 = vfmsub231ps_fma(auVar81,auVar130,auVar201);
          auVar82._4_4_ = auVar158._4_4_ * auVar130._4_4_;
          auVar82._0_4_ = auVar158._0_4_ * auVar130._0_4_;
          auVar82._8_4_ = auVar158._8_4_ * auVar130._8_4_;
          auVar82._12_4_ = auVar158._12_4_ * auVar130._12_4_;
          auVar82._16_4_ = auVar158._16_4_ * auVar130._16_4_;
          auVar82._20_4_ = auVar158._20_4_ * auVar130._20_4_;
          auVar82._24_4_ = auVar158._24_4_ * auVar130._24_4_;
          auVar82._28_4_ = auVar130._28_4_;
          auVar177 = vfmsub231ps_fma(auVar82,auVar200,auVar184);
          auVar130 = ZEXT832(0) << 0x20;
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar130,ZEXT1632(auVar22));
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar130,ZEXT1632(auVar114));
          auVar184 = vmaxps_avx(ZEXT1632(auVar116),ZEXT1632(auVar114));
          auVar184 = vcmpps_avx(auVar184,auVar130,2);
          auVar22 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar21 = vpand_avx(auVar22,auVar21);
          auVar184 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar184 >> 0x7f,0) == '\0') &&
                (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar184 >> 0xbf,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar184[0x1f]) {
LAB_013538a1:
            auVar169._8_8_ = uStack_698;
            auVar169._0_8_ = local_6a0;
            auVar169._16_8_ = uStack_690;
            auVar169._24_8_ = uStack_688;
          }
          else {
            auVar83._4_4_ = auVar25._4_4_ * auVar201._4_4_;
            auVar83._0_4_ = auVar25._0_4_ * auVar201._0_4_;
            auVar83._8_4_ = auVar25._8_4_ * auVar201._8_4_;
            auVar83._12_4_ = auVar25._12_4_ * auVar201._12_4_;
            auVar83._16_4_ = auVar25._16_4_ * auVar201._16_4_;
            auVar83._20_4_ = auVar25._20_4_ * auVar201._20_4_;
            auVar83._24_4_ = auVar25._24_4_ * auVar201._24_4_;
            auVar83._28_4_ = auVar184._28_4_;
            auVar157 = vfmsub231ps_fma(auVar83,auVar200,auVar121);
            auVar197._0_4_ = auVar121._0_4_ * auVar158._0_4_;
            auVar197._4_4_ = auVar121._4_4_ * auVar158._4_4_;
            auVar197._8_4_ = auVar121._8_4_ * auVar158._8_4_;
            auVar197._12_4_ = auVar121._12_4_ * auVar158._12_4_;
            auVar197._16_4_ = auVar121._16_4_ * auVar158._16_4_;
            auVar197._20_4_ = auVar121._20_4_ * auVar158._20_4_;
            auVar197._24_4_ = auVar121._24_4_ * auVar158._24_4_;
            auVar197._28_4_ = 0;
            auVar23 = vfmsub231ps_fma(auVar197,auVar180,auVar201);
            auVar84._4_4_ = auVar180._4_4_ * auVar200._4_4_;
            auVar84._0_4_ = auVar180._0_4_ * auVar200._0_4_;
            auVar84._8_4_ = auVar180._8_4_ * auVar200._8_4_;
            auVar84._12_4_ = auVar180._12_4_ * auVar200._12_4_;
            auVar84._16_4_ = auVar180._16_4_ * auVar200._16_4_;
            auVar84._20_4_ = auVar180._20_4_ * auVar200._20_4_;
            auVar84._24_4_ = auVar180._24_4_ * auVar200._24_4_;
            auVar84._28_4_ = auVar200._28_4_;
            auVar163 = vfmsub231ps_fma(auVar84,auVar158,auVar25);
            auVar22 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar23),ZEXT1632(auVar163));
            auVar177 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar157),auVar130);
            auVar184 = vrcpps_avx(ZEXT1632(auVar177));
            auVar230._8_4_ = 0x3f800000;
            auVar230._0_8_ = 0x3f8000003f800000;
            auVar230._12_4_ = 0x3f800000;
            auVar230._16_4_ = 0x3f800000;
            auVar230._20_4_ = 0x3f800000;
            auVar230._24_4_ = 0x3f800000;
            auVar230._28_4_ = 0x3f800000;
            auVar231 = ZEXT3264(auVar230);
            auVar22 = vfnmadd213ps_fma(auVar184,ZEXT1632(auVar177),auVar230);
            auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar184,auVar184);
            auVar85._4_4_ = auVar163._4_4_ * local_680._4_4_;
            auVar85._0_4_ = auVar163._0_4_ * local_680._0_4_;
            auVar85._8_4_ = auVar163._8_4_ * local_680._8_4_;
            auVar85._12_4_ = auVar163._12_4_ * local_680._12_4_;
            auVar85._16_4_ = local_680._16_4_ * 0.0;
            auVar85._20_4_ = local_680._20_4_ * 0.0;
            auVar85._24_4_ = local_680._24_4_ * 0.0;
            auVar85._28_4_ = auVar220._28_4_;
            auVar23 = vfmadd231ps_fma(auVar85,ZEXT1632(auVar23),auVar220);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT1632(auVar157),auVar119);
            fVar190 = auVar22._0_4_;
            fVar205 = auVar22._4_4_;
            fVar206 = auVar22._8_4_;
            fVar207 = auVar22._12_4_;
            auVar184 = ZEXT1632(CONCAT412(fVar207 * auVar23._12_4_,
                                          CONCAT48(fVar206 * auVar23._8_4_,
                                                   CONCAT44(fVar205 * auVar23._4_4_,
                                                            fVar190 * auVar23._0_4_))));
            uVar225 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar168._4_4_ = uVar225;
            auVar168._0_4_ = uVar225;
            auVar168._8_4_ = uVar225;
            auVar168._12_4_ = uVar225;
            auVar168._16_4_ = uVar225;
            auVar168._20_4_ = uVar225;
            auVar168._24_4_ = uVar225;
            auVar168._28_4_ = uVar225;
            auVar101._4_4_ = uStack_11c;
            auVar101._0_4_ = local_120;
            auVar101._8_4_ = uStack_118;
            auVar101._12_4_ = uStack_114;
            auVar101._16_4_ = uStack_110;
            auVar101._20_4_ = uStack_10c;
            auVar101._24_4_ = uStack_108;
            auVar101._28_4_ = uStack_104;
            auVar119 = vcmpps_avx(auVar101,auVar184,2);
            auVar220 = vcmpps_avx(auVar184,auVar168,2);
            auVar119 = vandps_avx(auVar220,auVar119);
            auVar22 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
            auVar21 = vpand_avx(auVar21,auVar22);
            auVar119 = vpmovsxwd_avx2(auVar21);
            if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar119 >> 0x7f,0) == '\0') &&
                  (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar119 >> 0xbf,0) == '\0') &&
                (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar119[0x1f]) goto LAB_013538a1;
            auVar119 = vcmpps_avx(ZEXT1632(auVar177),ZEXT832(0) << 0x20,4);
            auVar22 = vpackssdw_avx(auVar119._0_16_,auVar119._16_16_);
            auVar21 = vpand_avx(auVar21,auVar22);
            auVar119 = vpmovsxwd_avx2(auVar21);
            auVar169._8_8_ = uStack_698;
            auVar169._0_8_ = local_6a0;
            auVar169._16_8_ = uStack_690;
            auVar169._24_8_ = uStack_688;
            if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar119 >> 0x7f,0) != '\0') ||
                  (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0xbf,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar119[0x1f] < '\0') {
              auVar130 = ZEXT1632(CONCAT412(fVar207 * auVar116._12_4_,
                                            CONCAT48(fVar206 * auVar116._8_4_,
                                                     CONCAT44(fVar205 * auVar116._4_4_,
                                                              fVar190 * auVar116._0_4_))));
              auVar86._28_4_ = SUB84(uStack_688,4);
              auVar86._0_28_ =
                   ZEXT1628(CONCAT412(fVar207 * auVar114._12_4_,
                                      CONCAT48(fVar206 * auVar114._8_4_,
                                               CONCAT44(fVar205 * auVar114._4_4_,
                                                        fVar190 * auVar114._0_4_))));
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = 0x3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar220 = vsubps_avx(auVar204,auVar130);
              local_7c0 = vblendvps_avx(auVar220,auVar130,auVar24);
              auVar220 = vsubps_avx(auVar204,auVar86);
              local_4a0 = vblendvps_avx(auVar220,auVar86,auVar24);
              auVar169 = auVar119;
              local_600 = auVar184;
            }
          }
          auVar221 = ZEXT3264(local_640);
          auVar100._4_4_ = fStack_4bc;
          auVar100._0_4_ = local_4c0;
          auVar100._8_4_ = fStack_4b8;
          auVar100._12_4_ = fStack_4b4;
          auVar100._16_4_ = fStack_4b0;
          auVar100._20_4_ = fStack_4ac;
          auVar100._24_4_ = fStack_4a8;
          auVar100._28_4_ = fStack_4a4;
          auVar211 = ZEXT3264(auVar100);
          local_540 = auVar27;
          if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0x7f,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar169 >> 0xbf,0) != '\0') ||
              (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar169[0x1f] < '\0') {
            auVar119 = vsubps_avx(auVar178,local_500);
            auVar21 = vfmadd213ps_fma(auVar119,local_7c0,local_500);
            fVar190 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar87._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar190;
            auVar87._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar190;
            auVar87._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar190;
            auVar87._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar190;
            auVar87._16_4_ = fVar190 * 0.0;
            auVar87._20_4_ = fVar190 * 0.0;
            auVar87._24_4_ = fVar190 * 0.0;
            auVar87._28_4_ = fVar190;
            auVar119 = vcmpps_avx(local_600,auVar87,6);
            auVar220 = auVar169 & auVar119;
            if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar220 >> 0x7f,0) != '\0') ||
                  (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar220 >> 0xbf,0) != '\0') ||
                (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar220[0x1f] < '\0') {
              auVar143._8_4_ = 0xbf800000;
              auVar143._0_8_ = 0xbf800000bf800000;
              auVar143._12_4_ = 0xbf800000;
              auVar143._16_4_ = 0xbf800000;
              auVar143._20_4_ = 0xbf800000;
              auVar143._24_4_ = 0xbf800000;
              auVar143._28_4_ = 0xbf800000;
              auVar162._8_4_ = 0x40000000;
              auVar162._0_8_ = 0x4000000040000000;
              auVar162._12_4_ = 0x40000000;
              auVar162._16_4_ = 0x40000000;
              auVar162._20_4_ = 0x40000000;
              auVar162._24_4_ = 0x40000000;
              auVar162._28_4_ = 0x40000000;
              auVar21 = vfmadd213ps_fma(local_4a0,auVar162,auVar143);
              local_420 = local_7c0;
              local_400 = ZEXT1632(auVar21);
              local_3e0 = local_600;
              pGVar19 = (context->scene->geometries).items[uVar105].ptr;
              auVar149 = ZEXT3264(local_7c0);
              local_4a0 = local_400;
              if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01353593;
              local_700 = vandps_avx(auVar119,auVar169);
              fVar151 = (float)local_3c0;
              local_340[0] = (fVar151 + local_7c0._0_4_ + 0.0) * local_160;
              local_340[1] = (fVar151 + local_7c0._4_4_ + 1.0) * fStack_15c;
              local_340[2] = (fVar151 + local_7c0._8_4_ + 2.0) * fStack_158;
              local_340[3] = (fVar151 + local_7c0._12_4_ + 3.0) * fStack_154;
              fStack_330 = (fVar151 + local_7c0._16_4_ + 4.0) * fStack_150;
              fStack_32c = (fVar151 + local_7c0._20_4_ + 5.0) * fStack_14c;
              fStack_328 = (fVar151 + local_7c0._24_4_ + 6.0) * fStack_148;
              fStack_324 = fVar151 + local_7c0._28_4_ + 7.0;
              local_4a0._0_8_ = auVar21._0_8_;
              local_4a0._8_8_ = auVar21._8_8_;
              local_320 = local_4a0._0_8_;
              uStack_318 = local_4a0._8_8_;
              uStack_310 = 0;
              uStack_308 = 0;
              local_300 = local_600;
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar119 = vblendvps_avx(auVar144,local_600,local_700);
              auVar220 = vshufps_avx(auVar119,auVar119,0xb1);
              auVar220 = vminps_avx(auVar119,auVar220);
              auVar184 = vshufpd_avx(auVar220,auVar220,5);
              auVar220 = vminps_avx(auVar220,auVar184);
              auVar184 = vpermpd_avx2(auVar220,0x4e);
              auVar220 = vminps_avx(auVar220,auVar184);
              auVar220 = vcmpps_avx(auVar119,auVar220,0);
              auVar184 = local_700 & auVar220;
              auVar119 = local_700;
              if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar184 >> 0x7f,0) != '\0') ||
                    (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0xbf,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar184[0x1f] < '\0') {
                auVar119 = vandps_avx(auVar220,local_700);
              }
              uVar106 = vmovmskps_avx(auVar119);
              uVar7 = 0;
              for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                uVar7 = uVar7 + 1;
              }
              uVar107 = (ulong)uVar7;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar151 = local_340[uVar107];
                fVar150 = 1.0 - fVar151;
                auVar116 = ZEXT416((uint)fVar151);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar116,
                                          ZEXT416(0xc0a00000));
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                          ZEXT416((uint)(fVar151 + fVar151)),auVar21);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar116,
                                          ZEXT416(0x40000000));
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                          ZEXT416((uint)(fVar150 + fVar150)),auVar21);
                auVar114 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar150 + fVar150))),
                                            ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar116,
                                           ZEXT416((uint)(fVar150 * -2.0)));
                fVar150 = auVar21._0_4_ * 0.5;
                fVar185 = auVar116._0_4_ * 0.5;
                auVar166._0_4_ = fVar185 * local_920;
                auVar166._4_4_ = fVar185 * fStack_91c;
                auVar166._8_4_ = fVar185 * fStack_918;
                auVar166._12_4_ = fVar185 * fStack_914;
                auVar134._4_4_ = fVar150;
                auVar134._0_4_ = fVar150;
                auVar134._8_4_ = fVar150;
                auVar134._12_4_ = fVar150;
                auVar21 = vfmadd132ps_fma(auVar134,auVar166,auVar11);
                fVar150 = auVar22._0_4_ * 0.5;
                auVar167._4_4_ = fVar150;
                auVar167._0_4_ = fVar150;
                auVar167._8_4_ = fVar150;
                auVar167._12_4_ = fVar150;
                auVar21 = vfmadd132ps_fma(auVar167,auVar21,auVar12);
                uVar110 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                fVar150 = auVar114._0_4_ * 0.5;
                auVar153._4_4_ = fVar150;
                auVar153._0_4_ = fVar150;
                auVar153._8_4_ = fVar150;
                auVar153._12_4_ = fVar150;
                auVar21 = vfmadd132ps_fma(auVar153,auVar21,auVar13);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar21._0_4_;
                uVar225 = vextractps_avx(auVar21,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar225;
                uVar225 = vextractps_avx(auVar21,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar225;
                *(float *)(ray + k * 4 + 0x1e0) = fVar151;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar110;
                *(uint *)(ray + k * 4 + 0x220) = uVar18;
                *(uint *)(ray + k * 4 + 0x240) = uVar105;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar119 = vpcmpeqd_avx2(auVar100,auVar100);
                auVar170 = ZEXT3264(auVar119);
                local_7e0 = ray;
                _local_5a0 = auVar26;
                local_3bc = iVar104;
                local_3b0 = uVar176;
                uStack_3a8 = uVar89;
                local_3a0 = uVar90;
                uStack_398 = uVar91;
                local_390 = uVar92;
                uStack_388 = uVar93;
                local_380 = uVar94;
                uStack_378 = uVar95;
                while( true ) {
                  fVar151 = local_340[uVar107];
                  auVar117._4_4_ = fVar151;
                  auVar117._0_4_ = fVar151;
                  auVar117._8_4_ = fVar151;
                  auVar117._12_4_ = fVar151;
                  local_220._16_4_ = fVar151;
                  local_220._0_16_ = auVar117;
                  local_220._20_4_ = fVar151;
                  local_220._24_4_ = fVar151;
                  local_220._28_4_ = fVar151;
                  local_200 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
                  fVar150 = 1.0 - fVar151;
                  auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar117,
                                            ZEXT416(0xc0a00000));
                  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                            ZEXT416((uint)(fVar151 + fVar151)),auVar21);
                  auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar117,
                                            ZEXT416(0x40000000));
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                            ZEXT416((uint)(fVar150 + fVar150)),auVar21);
                  auVar114 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar150 + fVar150))),
                                              ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar117,
                                             ZEXT416((uint)(fVar150 * -2.0)));
                  fVar151 = auVar21._0_4_ * 0.5;
                  fVar150 = auVar116._0_4_ * 0.5;
                  auVar171._0_4_ = fVar150 * local_920;
                  auVar171._4_4_ = fVar150 * fStack_91c;
                  auVar171._8_4_ = fVar150 * fStack_918;
                  auVar171._12_4_ = fVar150 * fStack_914;
                  auVar154._4_4_ = fVar151;
                  auVar154._0_4_ = fVar151;
                  auVar154._8_4_ = fVar151;
                  auVar154._12_4_ = fVar151;
                  auVar21 = vfmadd132ps_fma(auVar154,auVar171,auVar14);
                  fVar151 = auVar22._0_4_ * 0.5;
                  auVar172._4_4_ = fVar151;
                  auVar172._0_4_ = fVar151;
                  auVar172._8_4_ = fVar151;
                  auVar172._12_4_ = fVar151;
                  auVar21 = vfmadd132ps_fma(auVar172,auVar21,auVar15);
                  local_830.context = context->user;
                  fVar151 = auVar114._0_4_ * 0.5;
                  auVar155._4_4_ = fVar151;
                  auVar155._0_4_ = fVar151;
                  auVar155._8_4_ = fVar151;
                  auVar155._12_4_ = fVar151;
                  auVar22 = vfmadd132ps_fma(auVar155,auVar21,auVar16);
                  local_280 = auVar22._0_4_;
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  auVar21 = vmovshdup_avx(auVar22);
                  local_260 = auVar21._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  auVar21 = vshufps_avx(auVar22,auVar22,0xaa);
                  local_240 = auVar21._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_560._0_8_;
                  uStack_1d8 = local_560._8_8_;
                  uStack_1d0 = CONCAT44(uStack_54c,uStack_550);
                  uStack_1c8 = CONCAT44(uStack_544,uStack_548);
                  local_1c0 = CONCAT44(uStack_13c,local_140);
                  uStack_1b8 = CONCAT44(uStack_134,uStack_138);
                  uStack_1b0 = CONCAT44(uStack_12c,uStack_130);
                  uStack_1a8 = CONCAT44(uStack_124,uStack_128);
                  local_7c8[1] = auVar170._0_32_;
                  *local_7c8 = auVar170._0_32_;
                  local_1a0 = (local_830.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_830.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_6e0 = local_2e0;
                  local_830.valid = (int *)local_6e0;
                  local_830.geometryUserPtr = pGVar19->userPtr;
                  local_830.hit = (RTCHitN *)&local_280;
                  local_830.N = 8;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar119 = ZEXT1632(auVar170._0_16_);
                    auVar231 = ZEXT1664(auVar231._0_16_);
                    auVar237 = ZEXT1664(auVar237._0_16_);
                    (*pGVar19->intersectionFilterN)(&local_830);
                    auVar119 = vpcmpeqd_avx2(auVar119,auVar119);
                    auVar170 = ZEXT3264(auVar119);
                    auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
                    ray = local_7e0;
                  }
                  auVar220 = vpcmpeqd_avx2(local_6e0,auVar149._0_32_);
                  auVar119 = auVar170._0_32_ & ~auVar220;
                  if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar119 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar119 >> 0x7f,0) == '\0') &&
                        (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar119 >> 0xbf,0) == '\0') &&
                      (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar119[0x1f]) {
                    auVar220 = auVar170._0_32_ ^ auVar220;
                  }
                  else {
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar119 = ZEXT1632(auVar170._0_16_);
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      (*p_Var20)(&local_830);
                      auVar119 = vpcmpeqd_avx2(auVar119,auVar119);
                      auVar170 = ZEXT3264(auVar119);
                      auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
                      ray = local_7e0;
                    }
                    auVar184 = vpcmpeqd_avx2(local_6e0,auVar149._0_32_);
                    auVar220 = auVar170._0_32_ ^ auVar184;
                    auVar119 = auVar170._0_32_ & ~auVar184;
                    if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar119 >> 0x7f,0) != '\0') ||
                          (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar119 >> 0xbf,0) != '\0') ||
                        (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar119[0x1f] < '\0') {
                      auVar145._0_4_ = auVar170._0_4_ ^ auVar184._0_4_;
                      auVar145._4_4_ = auVar170._4_4_ ^ auVar184._4_4_;
                      auVar145._8_4_ = auVar170._8_4_ ^ auVar184._8_4_;
                      auVar145._12_4_ = auVar170._12_4_ ^ auVar184._12_4_;
                      auVar145._16_4_ = auVar170._16_4_ ^ auVar184._16_4_;
                      auVar145._20_4_ = auVar170._20_4_ ^ auVar184._20_4_;
                      auVar145._24_4_ = auVar170._24_4_ ^ auVar184._24_4_;
                      auVar145._28_4_ = auVar170._28_4_ ^ auVar184._28_4_;
                      auVar119 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar119;
                      auVar119 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar145,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar145,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar145,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar119;
                      auVar119 = vpmaskmovd_avx2(auVar145,*(undefined1 (*) [32])
                                                           (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar119;
                    }
                  }
                  auVar119 = local_600;
                  if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar220 >> 0x7f,0) == '\0') &&
                        (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar220 >> 0xbf,0) == '\0') &&
                      (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar220[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar110;
                  }
                  else {
                    uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_700 + uVar107 * 4) = 0;
                  auVar131._4_4_ = uVar110;
                  auVar131._0_4_ = uVar110;
                  auVar131._8_4_ = uVar110;
                  auVar131._12_4_ = uVar110;
                  auVar131._16_4_ = uVar110;
                  auVar131._20_4_ = uVar110;
                  auVar131._24_4_ = uVar110;
                  auVar131._28_4_ = uVar110;
                  auVar184 = vcmpps_avx(auVar119,auVar131,2);
                  auVar220 = vandps_avx(auVar184,local_700);
                  local_700 = local_700 & auVar184;
                  if ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_700 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_700 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_700 >> 0x7f,0) == '\0') &&
                        (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_700 >> 0xbf,0) == '\0') &&
                      (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_700[0x1f]) break;
                  auVar146._8_4_ = 0x7f800000;
                  auVar146._0_8_ = 0x7f8000007f800000;
                  auVar146._12_4_ = 0x7f800000;
                  auVar146._16_4_ = 0x7f800000;
                  auVar146._20_4_ = 0x7f800000;
                  auVar146._24_4_ = 0x7f800000;
                  auVar146._28_4_ = 0x7f800000;
                  auVar119 = vblendvps_avx(auVar146,auVar119,auVar220);
                  auVar184 = vshufps_avx(auVar119,auVar119,0xb1);
                  auVar184 = vminps_avx(auVar119,auVar184);
                  auVar130 = vshufpd_avx(auVar184,auVar184,5);
                  auVar184 = vminps_avx(auVar184,auVar130);
                  auVar130 = vpermpd_avx2(auVar184,0x4e);
                  auVar184 = vminps_avx(auVar184,auVar130);
                  auVar184 = vcmpps_avx(auVar119,auVar184,0);
                  auVar130 = auVar220 & auVar184;
                  auVar119 = auVar220;
                  if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar130 >> 0x7f,0) != '\0') ||
                        (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar130 >> 0xbf,0) != '\0') ||
                      (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar130[0x1f] < '\0') {
                    auVar119 = vandps_avx(auVar184,auVar220);
                  }
                  uVar106 = vmovmskps_avx(auVar119);
                  uVar7 = 0;
                  for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                    uVar7 = uVar7 + 1;
                  }
                  uVar107 = (ulong)uVar7;
                  local_700 = auVar220;
                }
                auVar221 = ZEXT3264(local_640);
                auVar211 = ZEXT3264(CONCAT428(fStack_4a4,
                                              CONCAT424(fStack_4a8,
                                                        CONCAT420(fStack_4ac,
                                                                  CONCAT416(fStack_4b0,
                                                                            CONCAT412(fStack_4b4,
                                                                                      CONCAT48(
                                                  fStack_4b8,CONCAT44(fStack_4bc,local_4c0))))))));
              }
            }
          }
          auVar149 = ZEXT3264(local_7c0);
          fVar151 = (float)local_760;
          fVar150 = local_760._4_4_;
          fVar185 = (float)uStack_758;
          fVar186 = uStack_758._4_4_;
          fVar187 = (float)uStack_750;
          fVar188 = uStack_750._4_4_;
          fVar189 = (float)uStack_748;
          uVar110 = uStack_748._4_4_;
        }
LAB_01353593:
        auVar10._8_8_ = uStack_618;
        auVar10._0_8_ = local_620;
        auVar10._16_8_ = uStack_610;
        auVar10._24_8_ = uStack_608;
        auVar170 = ZEXT3264(local_720);
      }
    }
    uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar128._4_4_ = uVar110;
    auVar128._0_4_ = uVar110;
    auVar128._8_4_ = uVar110;
    auVar128._12_4_ = uVar110;
    auVar128._16_4_ = uVar110;
    auVar128._20_4_ = uVar110;
    auVar128._24_4_ = uVar110;
    auVar128._28_4_ = uVar110;
    auVar119 = vcmpps_avx(local_80,auVar128,2);
    uVar105 = vmovmskps_avx(auVar119);
    uVar111 = (ulong)((uint)uVar111 & uVar105);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }